

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::LayerNorm_x86_fma::forward_inplace(LayerNorm_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  bool bVar8;
  bool bVar9;
  bool bVar10;
  long lVar11;
  undefined1 (*pauVar12) [32];
  int iVar13;
  int iVar14;
  uint uVar15;
  undefined1 (*pauVar16) [32];
  uint uVar17;
  ulong uVar18;
  undefined1 (*pauVar19) [32];
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  undefined1 (*pauVar24) [32];
  uint uVar25;
  ulong uVar26;
  undefined1 (*pauVar27) [32];
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar73;
  float fVar74;
  __m128 _high;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  float fVar75;
  undefined1 auVar54 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar50 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float _a;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float _b;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar150 [16];
  undefined1 auVar156 [32];
  undefined1 auVar151 [16];
  undefined1 auVar157 [32];
  undefined1 auVar152 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 in_ZMM6 [64];
  __m128 _low;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  undefined1 auVar192 [64];
  undefined1 auVar194 [64];
  undefined1 auVar188 [32];
  undefined1 auVar195 [64];
  __m128 _a_128;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar212 [36];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  undefined1 auVar203 [32];
  undefined1 auVar211 [64];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 in_ZMM10 [64];
  __m128 _low_1;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 in_ZMM14 [64];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [64];
  ulong local_f8;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 auVar149 [32];
  undefined1 auVar191 [64];
  undefined1 auVar193 [64];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  
  auVar140 = in_ZMM14._0_16_;
  iVar14 = bottom_top_blob->elempack;
  iVar13 = bottom_top_blob->dims;
  iVar2 = bottom_top_blob->w;
  pp_Var3 = this->_vptr_LayerNorm_x86_fma;
  p_Var4 = pp_Var3[-3];
  pauVar24 = *(undefined1 (**) [32])(&this->field_0xe0 + (long)p_Var4);
  pauVar16 = *(undefined1 (**) [32])(&this->field_0x128 + (long)p_Var4);
  if (iVar13 == 1) {
    uVar22 = iVar2 * iVar14;
    pauVar27 = (undefined1 (*) [32])bottom_top_blob->data;
    pauVar12 = pauVar27;
    if ((int)uVar22 < 8) {
      uVar15 = 0;
      auVar70 = ZEXT832(0);
    }
    else {
      uVar15 = uVar22 & 0x7ffffff8;
      auVar174 = ZEXT864(0);
      iVar14 = 8;
      do {
        auVar70._0_4_ = auVar174._0_4_ + *(float *)*pauVar12;
        auVar70._4_4_ = auVar174._4_4_ + *(float *)(*pauVar12 + 4);
        auVar70._8_4_ = auVar174._8_4_ + *(float *)(*pauVar12 + 8);
        auVar70._12_4_ = auVar174._12_4_ + *(float *)(*pauVar12 + 0xc);
        auVar70._16_4_ = auVar174._16_4_ + *(float *)(*pauVar12 + 0x10);
        auVar70._20_4_ = auVar174._20_4_ + *(float *)(*pauVar12 + 0x14);
        auVar70._24_4_ = auVar174._24_4_ + *(float *)(*pauVar12 + 0x18);
        auVar70._28_4_ = auVar174._28_4_ + *(float *)(*pauVar12 + 0x1c);
        auVar174 = ZEXT3264(auVar70);
        pauVar12 = pauVar12 + 1;
        iVar14 = iVar14 + 8;
      } while (iVar14 <= (int)uVar22);
    }
    uVar21 = uVar15 | 4;
    auVar99 = ZEXT816(0) << 0x40;
    while( true ) {
      fVar28 = auVar99._4_4_;
      fVar30 = auVar99._8_4_;
      fVar73 = auVar99._12_4_;
      if ((int)uVar22 < (int)uVar21) break;
      auVar99._0_4_ = auVar99._0_4_ + *(float *)*pauVar12;
      auVar99._4_4_ = fVar28 + *(float *)(*pauVar12 + 4);
      auVar99._8_4_ = fVar30 + *(float *)(*pauVar12 + 8);
      auVar99._12_4_ = fVar73 + *(float *)(*pauVar12 + 0xc);
      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
      uVar21 = uVar15 + 8;
      uVar15 = uVar15 + 4;
    }
    fVar74 = 0.0;
    if ((int)uVar15 < (int)uVar22) {
      uVar26 = CONCAT44(0,~uVar15 + uVar22);
      auVar140._8_8_ = 0;
      auVar140._0_8_ = uVar26;
      auVar186 = vpshufd_avx(auVar140,0x44);
      uVar20 = 0;
      auVar150._8_8_ = 0x8000000000000000;
      auVar150._0_8_ = 0x8000000000000000;
      auVar142 = vorps_avx(auVar186,auVar150);
      auVar100 = vorps_avx(auVar186,auVar150);
      auVar167 = vpcmpeqd_avx(in_ZMM10._0_16_,in_ZMM10._0_16_);
      auVar178 = vorps_avx(auVar186,auVar150);
      auVar174 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar266 = auVar174;
        auVar219._8_8_ = 0;
        auVar219._0_8_ = uVar20;
        auVar140 = vpshufd_avx(auVar219,0x44);
        auVar241._16_16_ = auVar140;
        auVar241._0_16_ = auVar140;
        auVar71 = vorps_avx(auVar241,_DAT_00516cc0);
        auVar241 = vorps_avx(auVar241,_DAT_00516ce0);
        auVar248._0_8_ = auVar241._16_8_ ^ 0x8000000000000000;
        auVar248._8_4_ = auVar241._24_4_;
        auVar248._12_4_ = auVar241._28_4_ ^ 0x80000000;
        auVar219 = vpcmpgtq_avx(auVar248,auVar142);
        auVar261._0_8_ = auVar241._0_8_ ^ 0x8000000000000000;
        auVar261._8_4_ = auVar241._8_4_;
        auVar261._12_4_ = auVar241._12_4_ ^ 0x80000000;
        auVar140 = vpcmpgtq_avx(auVar261,auVar100);
        auVar141 = vpackssdw_avx(auVar140,auVar219);
        auVar262._0_8_ = auVar71._16_8_ ^ 0x8000000000000000;
        auVar262._8_4_ = auVar71._24_4_;
        auVar262._12_4_ = auVar71._28_4_ ^ 0x80000000;
        auVar140 = vpcmpgtq_avx(auVar262,auVar142);
        auVar154._0_8_ = auVar71._0_8_ ^ 0x8000000000000000;
        auVar154._8_4_ = auVar71._8_4_;
        auVar154._12_4_ = auVar71._12_4_ ^ 0x80000000;
        auVar154 = vpcmpgtq_avx(auVar154,auVar178);
        auVar154 = vpackssdw_avx(auVar154,auVar140);
        auVar141 = vpackssdw_avx(auVar167 ^ auVar154,auVar141 ^ auVar167);
        auVar154 = vpmovsxwd_avx(auVar141);
        auVar141 = vpunpckhwd_avx(auVar141,auVar141);
        auVar159._16_16_ = auVar141;
        auVar159._0_16_ = auVar154;
        auVar159 = vmaskmovps_avx(auVar159,*(undefined1 (*) [32])(*pauVar12 + uVar20 * 4));
        auVar141._0_4_ = auVar159._0_4_ + auVar266._0_4_;
        auVar141._4_4_ = auVar159._4_4_ + auVar266._4_4_;
        auVar141._8_4_ = auVar159._8_4_ + auVar266._8_4_;
        auVar141._12_4_ = auVar159._12_4_ + auVar266._12_4_;
        auVar149._16_4_ = auVar159._16_4_ + auVar266._16_4_;
        auVar149._0_16_ = auVar141;
        auVar149._20_4_ = auVar159._20_4_ + auVar266._20_4_;
        auVar149._24_4_ = auVar159._24_4_ + auVar266._24_4_;
        auVar149._28_4_ = auVar159._28_4_ + auVar266._28_4_;
        uVar20 = uVar20 + 8;
        auVar174 = ZEXT3264(auVar149);
      } while ((uVar26 + 8 & 0x1fffffff8) != uVar20);
      auVar142 = vorps_avx(auVar186,auVar150);
      auVar178._0_8_ = auVar241._0_8_ ^ 0x8000000000000000;
      auVar178._8_4_ = auVar241._8_4_;
      auVar178._12_4_ = auVar241._12_4_ ^ 0x80000000;
      auVar142 = vpcmpgtq_avx(auVar178,auVar142);
      auVar100 = vpackssdw_avx(auVar142,auVar219);
      auVar178 = vpcmpeqd_avx(auVar178,auVar178);
      auVar142 = vorps_avx(auVar186,auVar150);
      auVar167._8_4_ = auVar71._8_4_;
      auVar167._0_8_ = auVar71._0_8_ ^ 0x8000000000000000;
      auVar167._12_4_ = auVar71._12_4_ ^ 0x80000000;
      auVar142 = vpcmpgtq_avx(auVar167,auVar142);
      auVar142 = vpackssdw_avx(auVar142,auVar140);
      auVar142 = vblendvps_avx(auVar266._0_16_,auVar141,auVar142 ^ auVar178);
      auVar100 = vblendvps_avx(auVar266._16_16_,auVar149._16_16_,auVar100 ^ auVar178);
      auVar142 = vhaddps_avx(auVar100,auVar142);
      auVar142 = vhaddps_avx(auVar142,auVar142);
      auVar142 = vhaddps_avx(auVar142,auVar142);
      fVar74 = auVar142._0_4_;
    }
    auVar142 = vshufpd_avx(auVar99,auVar99,1);
    auVar100._0_4_ = auVar142._0_4_ + auVar99._0_4_;
    auVar100._4_4_ = auVar142._4_4_ + fVar28;
    auVar100._8_4_ = auVar142._8_4_ + fVar30;
    auVar100._12_4_ = auVar142._12_4_ + fVar73;
    auVar99 = vhaddps_avx(auVar70._16_16_,auVar70._0_16_);
    auVar142 = vmovshdup_avx(auVar100);
    auVar99 = vhaddps_avx(auVar99,auVar99);
    auVar99 = vhaddps_avx(auVar99,auVar99);
    auVar186._0_4_ = (float)(int)uVar22;
    auVar186._4_8_ = SUB128(ZEXT812(0),4);
    auVar186._12_4_ = 0;
    fVar28 = (auVar99._0_4_ + auVar142._0_4_ + auVar100._0_4_ + fVar74) / auVar186._0_4_;
    auVar99 = vshufps_avx(ZEXT416((uint)fVar28),ZEXT416((uint)fVar28),0);
    pauVar12 = pauVar27;
    if ((int)uVar22 < 8) {
      uVar15 = 0;
      auVar142 = ZEXT816(0) << 0x20;
    }
    else {
      auVar71._16_16_ = auVar99;
      auVar71._0_16_ = auVar99;
      uVar15 = uVar22 & 0x7ffffff8;
      auVar142 = ZEXT816(0) << 0x40;
      iVar14 = 8;
      do {
        auVar70 = vsubps_avx(*pauVar12,auVar71);
        auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar70,auVar70);
        pauVar12 = pauVar12 + 1;
        iVar14 = iVar14 + 8;
      } while (iVar14 <= (int)uVar22);
    }
    auVar174 = ZEXT864(0) << 0x20;
    auVar100 = auVar174._0_16_;
    uVar21 = uVar15 | 4;
    while ((int)uVar21 <= (int)uVar22) {
      auVar100 = vsubps_avx(*(undefined1 (*) [16])*pauVar12,auVar99);
      auVar100 = vfmadd231ps_fma(auVar174._0_16_,auVar100,auVar100);
      auVar174 = ZEXT1664(auVar100);
      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
      uVar21 = uVar15 + 8;
      uVar15 = uVar15 + 4;
    }
    fVar30 = 0.0;
    if ((int)uVar15 < (int)uVar22) {
      uVar20 = CONCAT44(0,~uVar15 + uVar22);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = uVar20;
      auVar150 = vpshufd_avx(auVar51,0x44);
      auVar205._16_16_ = auVar99;
      auVar205._0_16_ = auVar99;
      uVar26 = 0;
      auVar179._8_8_ = 0x8000000000000000;
      auVar179._0_8_ = 0x8000000000000000;
      auVar99 = vorps_avx(auVar150,auVar179);
      auVar178 = vorps_avx(auVar150,auVar179);
      auVar167 = vpcmpeqd_avx(auVar140,auVar140);
      auVar140 = vorps_avx(auVar150,auVar179);
      auVar141 = ZEXT816(0) << 0x40;
      do {
        auVar261 = auVar141;
        auVar101._8_8_ = 0;
        auVar101._0_8_ = uVar26;
        auVar141 = vpshufd_avx(auVar101,0x44);
        auVar127._16_16_ = auVar141;
        auVar127._0_16_ = auVar141;
        auVar70 = vorps_avx(auVar127,_DAT_00516cc0);
        auVar71 = vorps_avx(_DAT_00516ce0,auVar127);
        auVar168._0_8_ = auVar71._16_8_ ^ 0x8000000000000000;
        auVar168._8_4_ = auVar71._24_4_;
        auVar168._12_4_ = auVar71._28_4_ ^ 0x80000000;
        auVar219 = vpcmpgtq_avx(auVar168,auVar99);
        auVar181._0_8_ = auVar71._0_8_ ^ 0x8000000000000000;
        auVar102._8_4_ = auVar71._8_4_;
        auVar181._8_4_ = auVar102._8_4_;
        auVar181._12_4_ = auVar71._12_4_ ^ 0x80000000;
        auVar141 = vpcmpgtq_avx(auVar181,auVar178);
        auVar141 = vpackssdw_avx(auVar141,auVar219);
        auVar182._0_8_ = auVar70._16_8_ ^ 0x8000000000000000;
        auVar182._8_4_ = auVar70._24_4_;
        auVar182._12_4_ = auVar70._28_4_ ^ 0x80000000;
        auVar248 = vpcmpgtq_avx(auVar182,auVar99);
        auVar220._0_8_ = auVar70._0_8_ ^ 0x8000000000000000;
        auVar220._8_4_ = auVar70._8_4_;
        auVar220._12_4_ = auVar70._12_4_ ^ 0x80000000;
        auVar154 = vpcmpgtq_avx(auVar220,auVar140);
        auVar154 = vpackssdw_avx(auVar154,auVar248);
        auVar141 = vpackssdw_avx(auVar154 ^ auVar167,auVar167 ^ auVar141);
        auVar154 = vpmovsxwd_avx(auVar141);
        auVar141 = vpunpckhwd_avx(auVar141,auVar141);
        auVar223._16_16_ = auVar141;
        auVar223._0_16_ = auVar154;
        auVar241 = vmaskmovps_avx(auVar223,*(undefined1 (*) [32])(*pauVar12 + uVar26 * 4));
        auVar241 = vsubps_avx(auVar241,auVar205);
        auVar141 = vfmadd213ps_fma(auVar241,auVar241,ZEXT1632(auVar261));
        uVar26 = uVar26 + 8;
      } while ((uVar20 + 8 & 0x1fffffff8) != uVar26);
      auVar140 = vorps_avx(auVar150,auVar179);
      auVar102._0_8_ = auVar71._0_8_ ^ 0x8000000000000000;
      auVar102._12_4_ = auVar71._12_4_ ^ 0x80000000;
      auVar140 = vpcmpgtq_avx(auVar102,auVar140);
      auVar99 = vpackssdw_avx(auVar140,auVar219);
      auVar178 = vpcmpeqd_avx(auVar102,auVar102);
      auVar140 = vorps_avx(auVar150,auVar179);
      auVar140 = vpcmpgtq_avx(auVar70._0_16_ ^ auVar179,auVar140);
      auVar140 = vpackssdw_avx(auVar140,auVar248);
      auVar140 = vblendvps_avx(auVar261,auVar141,auVar140 ^ auVar178);
      auVar99 = vblendvps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,auVar99 ^ auVar178);
      auVar140 = vhaddps_avx(auVar99,auVar140);
      auVar140 = vhaddps_avx(auVar140,auVar140);
      auVar140 = vhaddps_avx(auVar140,auVar140);
      fVar30 = auVar140._0_4_;
      auVar186 = ZEXT416((uint)auVar186._0_4_);
    }
    auVar140 = vshufpd_avx(auVar100,auVar100,1);
    auVar155._0_4_ = auVar140._0_4_ + auVar100._0_4_;
    auVar155._4_4_ = auVar140._4_4_ + auVar100._4_4_;
    auVar155._8_4_ = auVar140._8_4_ + auVar100._8_4_;
    auVar155._12_4_ = auVar140._12_4_ + auVar100._12_4_;
    auVar140 = vhaddps_avx((undefined1  [16])0x0,auVar142);
    auVar99 = vmovshdup_avx(auVar155);
    auVar140 = vhaddps_avx(auVar140,auVar140);
    auVar140 = vhaddps_avx(auVar140,auVar140);
    fVar30 = *(float *)(&this->field_0xd4 + (long)p_Var4) +
             (auVar140._0_4_ + auVar99._0_4_ + auVar155._0_4_ + fVar30) / auVar186._0_4_;
    auVar140 = vrsqrtss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30));
    auVar99 = vfmadd213ss_fma(ZEXT416((uint)(fVar30 * auVar140._0_4_)),auVar140,ZEXT416(0xc0400000))
    ;
    fVar30 = auVar140._0_4_ * -0.5 * auVar99._0_4_;
    fVar28 = fVar30 * -fVar28;
    auVar142 = ZEXT416((uint)fVar30);
    auVar140 = vshufps_avx(auVar142,auVar142,0);
    auVar99 = vshufps_avx(ZEXT416((uint)fVar28),ZEXT416((uint)fVar28),0);
    auVar173._16_16_ = auVar140;
    auVar173._0_16_ = auVar140;
    auVar180._16_16_ = auVar99;
    auVar180._0_16_ = auVar99;
    uVar15 = 0;
    if (*(int *)(&this->field_0xd8 + (long)p_Var4) == 0) {
      if (7 < (int)uVar22) {
        uVar15 = uVar22 & 0x7ffffff8;
        iVar14 = 8;
        do {
          auVar142 = vfmadd132ps_fma(*pauVar27,auVar180,auVar173);
          *pauVar27 = ZEXT1632(auVar142);
          pauVar27 = pauVar27 + 1;
          iVar14 = iVar14 + 8;
        } while (iVar14 <= (int)uVar22);
      }
      uVar21 = uVar15 | 4;
      auVar70 = _DAT_00516cc0;
      auVar71 = _DAT_00516ce0;
      while (_DAT_00516cc0 = auVar70, _DAT_00516ce0 = auVar71, (int)uVar21 <= (int)uVar22) {
        auVar142 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar27,auVar99,auVar140);
        *(undefined1 (*) [16])*pauVar27 = auVar142;
        pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
        uVar21 = uVar15 + 8;
        uVar15 = uVar15 + 4;
        auVar70 = _DAT_00516cc0;
        auVar71 = _DAT_00516ce0;
      }
      if ((int)uVar15 < (int)uVar22) {
        uVar20 = CONCAT44(0,uVar22 + ~uVar15);
        auVar142._8_8_ = 0;
        auVar142._0_8_ = uVar20;
        auVar142 = vpshufd_avx(auVar142,0x44);
        auVar128._16_16_ = auVar140;
        auVar128._0_16_ = auVar140;
        auVar72._16_16_ = auVar99;
        auVar72._0_16_ = auVar99;
        uVar26 = 0;
        auVar169._8_8_ = 0x8000000000000000;
        auVar169._0_8_ = 0x8000000000000000;
        auVar140 = vorps_avx(auVar142,auVar169);
        auVar99 = vorps_avx(auVar142,auVar169);
        auVar100 = vpcmpeqd_avx(auVar186,auVar186);
        auVar142 = vorps_avx(auVar142,auVar169);
        do {
          auVar221._8_8_ = 0;
          auVar221._0_8_ = uVar26;
          auVar178 = vpshufd_avx(auVar221,0x44);
          auVar224._16_16_ = auVar178;
          auVar224._0_16_ = auVar178;
          auVar241 = vorps_avx(auVar224,auVar70);
          auVar159 = vorps_avx(auVar224,auVar71);
          auVar233._0_8_ = auVar159._16_8_ ^ 0x8000000000000000;
          auVar233._8_4_ = auVar159._24_4_;
          auVar233._12_4_ = auVar159._28_4_ ^ 0x80000000;
          auVar178 = vpcmpgtq_avx(auVar233,auVar140);
          auVar222._0_8_ = auVar159._0_8_ ^ 0x8000000000000000;
          auVar222._8_4_ = auVar159._8_4_;
          auVar222._12_4_ = auVar159._12_4_ ^ 0x80000000;
          auVar167 = vpcmpgtq_avx(auVar222,auVar99);
          auVar178 = vpackssdw_avx(auVar167,auVar178);
          auVar234._0_8_ = auVar241._16_8_ ^ 0x8000000000000000;
          auVar234._8_4_ = auVar241._24_4_;
          auVar234._12_4_ = auVar241._28_4_ ^ 0x80000000;
          auVar167 = vpcmpgtq_avx(auVar234,auVar140);
          auVar229._0_8_ = auVar241._0_8_ ^ 0x8000000000000000;
          auVar229._8_4_ = auVar241._8_4_;
          auVar229._12_4_ = auVar241._12_4_ ^ 0x80000000;
          auVar186 = vpcmpgtq_avx(auVar229,auVar142);
          auVar167 = vpackssdw_avx(auVar186,auVar167);
          auVar178 = vpackssdw_avx(auVar167 ^ auVar100,auVar178 ^ auVar100);
          auVar167 = vpmovsxwd_avx(auVar178);
          auVar178 = vpunpckhwd_avx(auVar178,auVar178);
          auVar225._16_16_ = auVar178;
          auVar225._0_16_ = auVar167;
          auVar241 = vmaskmovps_avx(auVar225,*(undefined1 (*) [32])(*pauVar27 + uVar26 * 4));
          auVar178 = vfmadd213ps_fma(auVar241,auVar128,auVar72);
          auVar241 = vmaskmovps_avx(auVar225,ZEXT1632(auVar178));
          *(undefined1 (*) [32])(*pauVar27 + uVar26 * 4) = auVar241;
          uVar26 = uVar26 + 8;
        } while ((uVar20 + 8 & 0x1fffffff8) != uVar26);
      }
    }
    else {
      if (7 < (int)uVar22) {
        uVar15 = uVar22 & 0x7ffffff8;
        iVar14 = 8;
        do {
          auVar100 = vfmadd132ps_fma(*pauVar27,auVar180,auVar173);
          auVar100 = vfmadd213ps_fma(ZEXT1632(auVar100),*pauVar24,*pauVar16);
          *pauVar27 = ZEXT1632(auVar100);
          pauVar27 = pauVar27 + 1;
          pauVar24 = pauVar24 + 1;
          pauVar16 = pauVar16 + 1;
          iVar14 = iVar14 + 8;
        } while (iVar14 <= (int)uVar22);
      }
      uVar21 = uVar15 | 4;
      while ((int)uVar21 <= (int)uVar22) {
        auVar100 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar27,auVar99,auVar140);
        auVar100 = vfmadd213ps_fma(auVar100,*(undefined1 (*) [16])*pauVar24,
                                   *(undefined1 (*) [16])*pauVar16);
        *(undefined1 (*) [16])*pauVar27 = auVar100;
        pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
        pauVar24 = (undefined1 (*) [32])(*pauVar24 + 0x10);
        pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
        uVar21 = uVar15 + 8;
        uVar15 = uVar15 + 4;
      }
      if (uVar22 - uVar15 != 0 && (int)uVar15 <= (int)uVar22) {
        lVar11 = 0;
        do {
          auVar140 = vfmadd132ss_fma(ZEXT416(*(uint *)(*pauVar27 + lVar11 * 4)),
                                     ZEXT416((uint)fVar28),auVar142);
          auVar140 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar24 + lVar11 * 4)),auVar140,
                                     ZEXT416(*(uint *)(*pauVar16 + lVar11 * 4)));
          *(int *)(*pauVar27 + lVar11 * 4) = auVar140._0_4_;
          lVar11 = lVar11 + 1;
        } while (uVar22 - uVar15 != (int)lVar11);
      }
    }
  }
  else {
    uVar22 = bottom_top_blob->h;
    auVar140 = in_ZMM6._0_16_;
    if (iVar13 == 3) {
      uVar15 = bottom_top_blob->c;
      if (*(int *)(&this->field_0xd0 + (long)p_Var4) == iVar2) {
        if (0 < (int)uVar15) {
          uVar21 = iVar2 * iVar14;
          fVar28 = 1.0 / (float)iVar2;
          auVar99 = vshufps_avx(ZEXT416((uint)fVar28),ZEXT416((uint)fVar28),0);
          uVar25 = uVar21 & 0xfffffff8;
          local_f8 = 0;
          auVar266 = ZEXT3264(_DAT_00516cc0);
          auVar174 = ZEXT3264(_DAT_00516ce0);
          auVar176._8_8_ = 0x8000000000000000;
          auVar176._0_8_ = 0x8000000000000000;
          auVar140 = vpcmpeqd_avx(auVar140,auVar140);
          do {
            if (0 < (int)uVar22) {
              uVar26 = 0;
              do {
                pauVar27 = (undefined1 (*) [32])
                           ((long)bottom_top_blob->data +
                           (long)bottom_top_blob->w * uVar26 * bottom_top_blob->elemsize +
                           bottom_top_blob->cstep * local_f8 * bottom_top_blob->elemsize);
                pauVar12 = pauVar27;
                if ((int)uVar21 < 8) {
                  auVar190 = ZEXT864(0);
                  uVar17 = 0;
                }
                else {
                  auVar190 = ZEXT864(0);
                  iVar13 = 8;
                  do {
                    auVar190 = ZEXT3264(CONCAT428(auVar190._28_4_ + *(float *)(*pauVar12 + 0x1c),
                                                  CONCAT424(auVar190._24_4_ +
                                                            *(float *)(*pauVar12 + 0x18),
                                                            CONCAT420(auVar190._20_4_ +
                                                                      *(float *)(*pauVar12 + 0x14),
                                                                      CONCAT416(auVar190._16_4_ +
                                                                                *(float *)(*pauVar12
                                                                                          + 0x10),
                                                                                CONCAT412(auVar190.
                                                  _12_4_ + *(float *)(*pauVar12 + 0xc),
                                                  CONCAT48(auVar190._8_4_ +
                                                           *(float *)(*pauVar12 + 8),
                                                           CONCAT44(auVar190._4_4_ +
                                                                    *(float *)(*pauVar12 + 4),
                                                                    auVar190._0_4_ +
                                                                    *(float *)*pauVar12))))))));
                    pauVar12 = pauVar12 + 1;
                    iVar13 = iVar13 + 8;
                    uVar17 = uVar25;
                  } while (iVar13 <= (int)uVar21);
                }
                uVar23 = uVar17 | 4;
                auVar198 = ZEXT816(0) << 0x40;
                while( true ) {
                  fVar30 = auVar198._0_4_;
                  fVar73 = auVar198._4_4_;
                  fVar74 = auVar198._8_4_;
                  fVar75 = auVar198._12_4_;
                  if ((int)uVar21 < (int)uVar23) break;
                  auVar198._0_4_ = fVar30 + *(float *)*pauVar12;
                  auVar198._4_4_ = fVar73 + *(float *)(*pauVar12 + 4);
                  auVar198._8_4_ = fVar74 + *(float *)(*pauVar12 + 8);
                  auVar198._12_4_ = fVar75 + *(float *)(*pauVar12 + 0xc);
                  pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
                  uVar23 = uVar17 + 8;
                  uVar17 = uVar17 + 4;
                }
                auVar142 = ZEXT816(0) << 0x20;
                fVar29 = 0.0;
                auVar70 = auVar266._0_32_;
                if ((int)uVar17 < (int)uVar21) {
                  uVar20 = CONCAT44(0,~uVar17 + uVar21);
                  auVar37._8_8_ = 0;
                  auVar37._0_8_ = uVar20;
                  auVar178 = vpshufd_avx(auVar37,0x44);
                  auVar142 = vorps_avx(auVar178,auVar176);
                  auVar100 = vorps_avx(auVar178,auVar176);
                  uVar18 = 0;
                  auVar160 = ZEXT1664(ZEXT816(0) << 0x40);
                  do {
                    auVar206 = auVar160;
                    auVar84._8_8_ = 0;
                    auVar84._0_8_ = uVar18;
                    auVar167 = vpshufd_avx(auVar84,0x44);
                    auVar111._16_16_ = auVar167;
                    auVar111._0_16_ = auVar167;
                    auVar71 = vorps_avx(auVar70,auVar111);
                    auVar241 = vorps_avx(auVar111,auVar174._0_32_);
                    auVar167 = vorps_avx(auVar178,auVar176);
                    auVar227._8_4_ = auVar241._24_4_;
                    auVar227._0_8_ = auVar241._16_8_ ^ 0x8000000000000000;
                    auVar227._12_4_ = auVar241._28_4_ ^ 0x80000000;
                    auVar150 = vpcmpgtq_avx(auVar227,auVar167);
                    auVar85._8_4_ = auVar241._8_4_;
                    auVar244._8_4_ = auVar85._8_4_;
                    auVar244._0_8_ = auVar241._0_8_ ^ 0x8000000000000000;
                    auVar244._12_4_ = auVar241._12_4_ ^ 0x80000000;
                    auVar186 = vpcmpgtq_avx(auVar244,auVar142);
                    auVar186 = vpackssdw_avx(auVar186,auVar150);
                    auVar255._0_8_ = auVar71._16_8_ ^ 0x8000000000000000;
                    auVar255._8_4_ = auVar71._24_4_;
                    auVar255._12_4_ = auVar71._28_4_ ^ 0x80000000;
                    auVar141 = vpcmpgtq_avx(auVar255,auVar167);
                    auVar256._0_8_ = auVar71._0_8_ ^ 0x8000000000000000;
                    auVar256._8_4_ = auVar71._8_4_;
                    auVar256._12_4_ = auVar71._12_4_ ^ 0x80000000;
                    auVar167 = vpcmpgtq_avx(auVar256,auVar100);
                    auVar167 = vpackssdw_avx(auVar167,auVar141);
                    auVar167 = vpackssdw_avx(auVar167 ^ auVar140,auVar186 ^ auVar140);
                    auVar186 = vpmovsxwd_avx(auVar167);
                    auVar167 = vpunpckhwd_avx(auVar167,auVar167);
                    auVar250._16_16_ = auVar167;
                    auVar250._0_16_ = auVar186;
                    auVar159 = vmaskmovps_avx(auVar250,*(undefined1 (*) [32])
                                                        (*pauVar12 + uVar18 * 4));
                    auVar231._0_4_ = auVar159._0_4_ + auVar206._0_4_;
                    auVar231._4_4_ = auVar159._4_4_ + auVar206._4_4_;
                    auVar231._8_4_ = auVar159._8_4_ + auVar206._8_4_;
                    auVar231._12_4_ = auVar159._12_4_ + auVar206._12_4_;
                    auVar236._16_4_ = auVar159._16_4_ + auVar206._16_4_;
                    auVar236._0_16_ = auVar231;
                    auVar236._20_4_ = auVar159._20_4_ + auVar206._20_4_;
                    auVar236._24_4_ = auVar159._24_4_ + auVar206._24_4_;
                    auVar236._28_4_ = auVar159._28_4_ + auVar206._28_4_;
                    uVar18 = uVar18 + 8;
                    auVar160 = ZEXT3264(auVar236);
                  } while ((uVar20 + 8 & 0x1fffffff8) != uVar18);
                  auVar142 = vorps_avx(auVar178,auVar176);
                  auVar85._0_8_ = auVar241._0_8_ ^ 0x8000000000000000;
                  auVar85._12_4_ = auVar241._12_4_ ^ 0x80000000;
                  auVar142 = vpcmpgtq_avx(auVar85,auVar142);
                  auVar100 = vpackssdw_avx(auVar142,auVar150);
                  auVar142 = vorps_avx(auVar178,auVar176);
                  auVar133._0_8_ = auVar71._0_8_ ^ 0x8000000000000000;
                  auVar133._8_4_ = auVar71._8_4_;
                  auVar133._12_4_ = auVar71._12_4_ ^ 0x80000000;
                  auVar142 = vpcmpgtq_avx(auVar133,auVar142);
                  auVar142 = vpackssdw_avx(auVar142,auVar141);
                  auVar142 = vblendvps_avx(auVar206._0_16_,auVar231,auVar142 ^ auVar140);
                  auVar100 = vblendvps_avx(auVar206._16_16_,auVar236._16_16_,auVar100 ^ auVar140);
                  auVar142 = vhaddps_avx(auVar100,auVar142);
                  auVar142 = vhaddps_avx(auVar142,auVar142);
                  auVar142 = vhaddps_avx(auVar142,auVar142);
                  fVar29 = auVar142._0_4_;
                  auVar142 = ZEXT816(0);
                }
                auVar160 = ZEXT1664(auVar142 << 0x20);
                local_d8 = auVar99._0_4_;
                fStack_d4 = auVar99._4_4_;
                fStack_d0 = auVar99._8_4_;
                fStack_cc = auVar99._12_4_;
                if (iVar14 == 8) {
                  auVar184._0_4_ = auVar190._0_4_ * local_d8;
                  auVar184._4_4_ = auVar190._4_4_ * fStack_d4;
                  auVar184._8_4_ = auVar190._8_4_ * fStack_d0;
                  auVar184._12_4_ = auVar190._12_4_ * fStack_cc;
                  auVar193._16_4_ = auVar190._16_4_ * local_d8;
                  auVar193._0_16_ = auVar184;
                  auVar193._20_4_ = auVar190._20_4_ * fStack_d4;
                  auVar193._28_36_ = auVar190._28_36_;
                  auVar193._24_4_ = auVar190._24_4_ * fStack_d0;
                  auVar58 = auVar193._0_32_;
                  auVar190 = ZEXT3264(auVar58);
                  auVar199 = vshufps_avx(auVar184,auVar184,0);
                  bVar8 = true;
                  bVar10 = false;
                  auVar160 = ZEXT1664(auVar184);
                  bVar9 = false;
                }
                else {
                  if (iVar14 == 4) {
                    auVar199._0_4_ = (fVar30 + auVar190._16_4_ + auVar190._0_4_) * local_d8;
                    auVar199._4_4_ = (fVar73 + auVar190._20_4_ + auVar190._4_4_) * fStack_d4;
                    auVar199._8_4_ = (fVar74 + auVar190._24_4_ + auVar190._8_4_) * fStack_d0;
                    auVar199._12_4_ = (fVar75 + auVar190._28_4_ + auVar190._12_4_) * fStack_cc;
                    bVar9 = true;
                    bVar10 = false;
                    auVar160 = ZEXT1664(auVar199);
                    auVar142 = auVar199;
                  }
                  else {
                    if (iVar14 != 1) {
                      auVar142 = ZEXT816(0);
                      auVar199 = ZEXT816(0) << 0x40;
                    }
                    else {
                      auVar100 = vshufpd_avx(auVar198,auVar198,1);
                      auVar142 = vhaddps_avx(auVar190._16_16_,auVar190._0_16_);
                      auVar134._0_4_ = fVar30 + auVar100._0_4_;
                      auVar134._4_4_ = fVar73 + auVar100._4_4_;
                      auVar134._8_4_ = fVar74 + auVar100._8_4_;
                      auVar134._12_4_ = fVar75 + auVar100._12_4_;
                      auVar142 = vhaddps_avx(auVar142,auVar142);
                      auVar100 = vmovshdup_avx(auVar134);
                      auVar142 = vhaddps_avx(auVar142,auVar142);
                      fVar30 = (auVar142._0_4_ + auVar100._0_4_ + auVar134._0_4_ + fVar29) * fVar28;
                      auVar160 = ZEXT464((uint)fVar30);
                      auVar142 = vblendps_avx(ZEXT416((uint)fVar30),_DAT_00514070,0xe);
                      auVar199 = vshufps_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30),0);
                    }
                    bVar10 = iVar14 == 1;
                    bVar9 = false;
                  }
                  auVar190 = ZEXT1664(auVar142);
                  auVar58._16_16_ = auVar199;
                  auVar58._0_16_ = auVar199;
                  bVar8 = false;
                }
                auVar212 = (undefined1  [36])0x0;
                pauVar12 = pauVar27;
                if ((int)uVar21 < 8) {
                  auVar71 = SUB6432(ZEXT864(0),0);
                  uVar17 = 0;
                }
                else {
                  auVar206 = ZEXT864(0);
                  iVar13 = 8;
                  do {
                    auVar71 = vsubps_avx(*pauVar12,auVar58);
                    auVar142 = vfmadd231ps_fma(auVar206._0_32_,auVar71,auVar71);
                    auVar206 = ZEXT1664(auVar142);
                    auVar71 = ZEXT1632(auVar142);
                    pauVar12 = pauVar12 + 1;
                    iVar13 = iVar13 + 8;
                    uVar17 = uVar25;
                  } while (iVar13 <= (int)uVar21);
                }
                auVar142 = ZEXT816(0) << 0x40;
                uVar23 = uVar17 | 4;
                while ((int)uVar23 <= (int)uVar21) {
                  auVar100 = vsubps_avx(*(undefined1 (*) [16])*pauVar12,auVar199);
                  auVar142 = vfmadd231ps_fma(auVar142,auVar100,auVar100);
                  pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
                  uVar23 = uVar17 + 8;
                  uVar17 = uVar17 + 4;
                }
                fVar30 = 0.0;
                if ((int)uVar17 < (int)uVar21) {
                  uVar20 = CONCAT44(0,~uVar17 + uVar21);
                  auVar38._8_8_ = 0;
                  auVar38._0_8_ = uVar20;
                  auVar167 = vpshufd_avx(auVar38,0x44);
                  auVar212 = ZEXT436(auVar167._12_4_);
                  auVar150 = auVar160._0_16_;
                  auVar100 = vshufps_avx(auVar150,auVar150,0);
                  auVar264._16_16_ = auVar100;
                  auVar264._0_16_ = auVar100;
                  auVar100 = vorps_avx(auVar167,auVar176);
                  auVar178 = vorps_avx(auVar167,auVar176);
                  uVar18 = 0;
                  auVar186 = ZEXT416(0) << 0x40;
                  do {
                    auVar248 = auVar186;
                    auVar39._8_8_ = 0;
                    auVar39._0_8_ = uVar18;
                    auVar186 = vpshufd_avx(auVar39,0x44);
                    auVar112._16_16_ = auVar186;
                    auVar112._0_16_ = auVar186;
                    auVar241 = vorps_avx(auVar112,auVar70);
                    auVar159 = vorps_avx(auVar112,auVar174._0_32_);
                    auVar186 = vorps_avx(auVar167,auVar176);
                    auVar239._0_8_ = auVar159._16_8_ ^ 0x8000000000000000;
                    auVar239._8_4_ = auVar159._24_4_;
                    auVar239._12_4_ = auVar159._28_4_ ^ 0x80000000;
                    auVar154 = vpcmpgtq_avx(auVar239,auVar186);
                    auVar257._0_8_ = auVar159._0_8_ ^ 0x8000000000000000;
                    auVar86._8_4_ = auVar159._8_4_;
                    auVar257._8_4_ = auVar86._8_4_;
                    auVar257._12_4_ = auVar159._12_4_ ^ 0x80000000;
                    auVar141 = vpcmpgtq_avx(auVar257,auVar100);
                    auVar141 = vpackssdw_avx(auVar141,auVar154);
                    auVar163._0_8_ = auVar241._16_8_ ^ 0x8000000000000000;
                    auVar163._8_4_ = auVar241._24_4_;
                    auVar163._12_4_ = auVar241._28_4_ ^ 0x80000000;
                    auVar219 = vpcmpgtq_avx(auVar163,auVar186);
                    auVar164._0_8_ = auVar241._0_8_ ^ 0x8000000000000000;
                    auVar40._8_4_ = auVar241._8_4_;
                    auVar164._8_4_ = auVar40._8_4_;
                    auVar164._12_4_ = auVar241._12_4_ ^ 0x80000000;
                    auVar186 = vpcmpgtq_avx(auVar164,auVar178);
                    auVar186 = vpackssdw_avx(auVar186,auVar219);
                    auVar186 = vpackssdw_avx(auVar186 ^ auVar140,auVar141 ^ auVar140);
                    auVar141 = vpmovsxwd_avx(auVar186);
                    auVar186 = vpunpckhwd_avx(auVar186,auVar186);
                    auVar171._16_16_ = auVar186;
                    auVar171._0_16_ = auVar141;
                    auVar149 = vmaskmovps_avx(auVar171,*(undefined1 (*) [32])
                                                        (*pauVar12 + uVar18 * 4));
                    auVar149 = vsubps_avx(auVar149,auVar264);
                    auVar174 = ZEXT3264(_DAT_00516ce0);
                    auVar186 = vfmadd213ps_fma(auVar149,auVar149,ZEXT1632(auVar248));
                    uVar18 = uVar18 + 8;
                  } while ((uVar20 + 8 & 0x1fffffff8) != uVar18);
                  auVar100 = vorps_avx(auVar167,auVar176);
                  auVar86._0_8_ = auVar159._0_8_ ^ 0x8000000000000000;
                  auVar86._12_4_ = auVar159._12_4_ ^ 0x80000000;
                  auVar100 = vpcmpgtq_avx(auVar86,auVar100);
                  auVar178 = vpackssdw_avx(auVar100,auVar154);
                  auVar100 = vorps_avx(auVar167,auVar176);
                  auVar40._0_8_ = auVar241._0_8_ ^ 0x8000000000000000;
                  auVar40._12_4_ = auVar241._12_4_ ^ 0x80000000;
                  auVar100 = vpcmpgtq_avx(auVar40,auVar100);
                  auVar100 = vpackssdw_avx(auVar100,auVar219);
                  auVar100 = vblendvps_avx(auVar248,auVar186,auVar100 ^ auVar140);
                  auVar178 = vblendvps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,
                                           auVar178 ^ auVar140);
                  auVar100 = vhaddps_avx(auVar178,auVar100);
                  auVar100 = vhaddps_avx(auVar100,auVar100);
                  auVar100 = vhaddps_avx(auVar100,auVar100);
                  fVar30 = auVar100._0_4_;
                  auVar266 = ZEXT3264(auVar70);
                  auVar190 = ZEXT3264(auVar190._0_32_);
                  auVar160 = ZEXT1664(auVar150);
                }
                auVar100 = ZEXT416((uint)*(float *)(&this->field_0xd4 + (long)pp_Var3[-3]));
                auVar116 = auVar190._0_32_;
                if (bVar8) {
                  auVar209._0_4_ = auVar71._0_4_ * local_d8;
                  auVar209._4_4_ = auVar71._4_4_ * fStack_d4;
                  auVar209._8_4_ = auVar71._8_4_ * fStack_d0;
                  auVar209._12_4_ = auVar71._12_4_ * fStack_cc;
                  auVar209._16_4_ = auVar71._16_4_ * local_d8;
                  auVar209._20_4_ = auVar71._20_4_ * fStack_d4;
                  auVar209._24_4_ = auVar71._24_4_ * fStack_d0;
                  auVar209._28_36_ = auVar212;
                  auVar206 = ZEXT3264(auVar209._0_32_);
                }
                else {
                  auVar206 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                auVar245 = auVar142;
                if (bVar9) {
                  auVar245._0_4_ = auVar142._0_4_ + auVar71._0_4_ + auVar71._16_4_;
                  auVar245._4_4_ = auVar142._4_4_ + auVar71._4_4_ + auVar71._20_4_;
                  auVar245._8_4_ = auVar142._8_4_ + auVar71._8_4_ + auVar71._24_4_;
                  auVar245._12_4_ = auVar142._12_4_ + auVar71._12_4_ + auVar71._28_4_;
                  auVar70 = vblendps_avx(auVar206._0_32_,
                                         ZEXT1632(CONCAT412(auVar245._12_4_ * fStack_cc,
                                                            CONCAT48(auVar245._8_4_ * fStack_d0,
                                                                     CONCAT44(auVar245._4_4_ *
                                                                              fStack_d4,
                                                                              auVar245._0_4_ *
                                                                              local_d8)))),0xf);
                  auVar206 = ZEXT3264(auVar70);
                }
                if (bVar10) {
                  auVar142 = vshufpd_avx(auVar245,auVar245,1);
                  auVar87._0_4_ = auVar245._0_4_ + auVar142._0_4_;
                  auVar87._4_4_ = auVar245._4_4_ + auVar142._4_4_;
                  auVar87._8_4_ = auVar245._8_4_ + auVar142._8_4_;
                  auVar87._12_4_ = auVar245._12_4_ + auVar142._12_4_;
                  auVar142 = vhaddps_avx(auVar71._16_16_,auVar71._0_16_);
                  auVar178 = vmovshdup_avx(auVar87);
                  auVar142 = vhaddps_avx(auVar142,auVar142);
                  auVar142 = vhaddps_avx(auVar142,auVar142);
                  auVar70 = vblendps_avx(auVar206._0_32_,
                                         ZEXT432((uint)((fVar30 + auVar142._0_4_ + auVar178._0_4_ +
                                                        auVar87._0_4_) * fVar28)),1);
                  auVar206 = ZEXT3264(auVar70);
                }
                fVar30 = auVar206._0_4_;
                auVar63 = auVar206._0_32_;
                if (iVar14 == 1) {
                  fVar30 = fVar30 + *(float *)(&this->field_0xd4 + (long)pp_Var3[-3]);
                  auVar142 = vrsqrtss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30));
                  auVar100 = vfmadd213ss_fma(ZEXT416((uint)(fVar30 * auVar142._0_4_)),auVar142,
                                             ZEXT416(0xc0400000));
                  fVar30 = auVar142._0_4_ * -0.5 * auVar100._0_4_;
                  auVar63 = vblendps_avx(auVar63,ZEXT432((uint)fVar30),1);
                  auVar116 = vblendps_avx(auVar116,ZEXT432((uint)(fVar30 * -auVar160._0_4_)),1);
                }
                else if (iVar14 == 4) {
                  auVar142 = vshufps_avx(auVar100,auVar100,0);
                  auVar41._0_4_ = fVar30 + auVar142._0_4_;
                  auVar41._4_4_ = auVar206._4_4_ + auVar142._4_4_;
                  auVar41._8_4_ = auVar206._8_4_ + auVar142._8_4_;
                  auVar41._12_4_ = auVar206._12_4_ + auVar142._12_4_;
                  auVar142 = vrsqrtps_avx(auVar41);
                  auVar42._0_4_ = auVar41._0_4_ * auVar142._0_4_;
                  auVar42._4_4_ = auVar41._4_4_ * auVar142._4_4_;
                  auVar42._8_4_ = auVar41._8_4_ * auVar142._8_4_;
                  auVar42._12_4_ = auVar41._12_4_ * auVar142._12_4_;
                  auVar135._8_4_ = 0xc0400000;
                  auVar135._0_8_ = 0xc0400000c0400000;
                  auVar135._12_4_ = 0xc0400000;
                  auVar100 = vfmadd213ps_fma(auVar42,auVar142,auVar135);
                  fVar30 = auVar142._0_4_ * -0.5 * auVar100._0_4_;
                  fVar73 = auVar142._4_4_ * -0.5 * auVar100._4_4_;
                  fVar74 = auVar142._8_4_ * -0.5 * auVar100._8_4_;
                  fVar75 = auVar142._12_4_ * -0.5 * auVar100._12_4_;
                  auVar63 = vblendps_avx(auVar63,ZEXT1632(CONCAT412(fVar75,CONCAT48(fVar74,CONCAT44(
                                                  fVar73,fVar30)))),0xf);
                  auVar116 = vblendps_avx(auVar116,ZEXT1632(CONCAT412(fVar75 * -auVar190._12_4_,
                                                                      CONCAT48(fVar74 * -auVar190.
                                                  _8_4_,CONCAT44(fVar73 * -auVar190._4_4_,
                                                                 fVar30 * -auVar190._0_4_)))),0xf);
                }
                else if (iVar14 == 8) {
                  auVar142 = vshufps_avx(auVar100,auVar100,0);
                  auVar59._0_4_ = fVar30 + auVar142._0_4_;
                  auVar59._4_4_ = auVar206._4_4_ + auVar142._4_4_;
                  auVar59._8_4_ = auVar206._8_4_ + auVar142._8_4_;
                  auVar59._12_4_ = auVar206._12_4_ + auVar142._12_4_;
                  auVar59._16_4_ = auVar206._16_4_ + auVar142._0_4_;
                  auVar59._20_4_ = auVar206._20_4_ + auVar142._4_4_;
                  auVar59._24_4_ = auVar206._24_4_ + auVar142._8_4_;
                  auVar59._28_4_ = auVar206._28_4_ + auVar142._12_4_;
                  auVar70 = vrsqrtps_avx(auVar59);
                  auVar6._4_4_ = auVar59._4_4_ * auVar70._4_4_;
                  auVar6._0_4_ = auVar59._0_4_ * auVar70._0_4_;
                  auVar6._8_4_ = auVar59._8_4_ * auVar70._8_4_;
                  auVar6._12_4_ = auVar59._12_4_ * auVar70._12_4_;
                  auVar6._16_4_ = auVar59._16_4_ * auVar70._16_4_;
                  auVar6._20_4_ = auVar59._20_4_ * auVar70._20_4_;
                  auVar6._24_4_ = auVar59._24_4_ * auVar70._24_4_;
                  auVar6._28_4_ = auVar59._28_4_;
                  auVar145._8_4_ = 0xc0400000;
                  auVar145._0_8_ = 0xc0400000c0400000;
                  auVar145._12_4_ = 0xc0400000;
                  auVar145._16_4_ = 0xc0400000;
                  auVar145._20_4_ = 0xc0400000;
                  auVar145._24_4_ = 0xc0400000;
                  auVar145._28_4_ = 0xc0400000;
                  auVar142 = vfmadd213ps_fma(auVar6,auVar70,auVar145);
                  auVar210._0_4_ = auVar70._0_4_ * -0.5 * auVar142._0_4_;
                  auVar210._4_4_ = auVar70._4_4_ * -0.5 * auVar142._4_4_;
                  auVar210._8_4_ = auVar70._8_4_ * -0.5 * auVar142._8_4_;
                  auVar210._12_4_ = auVar70._12_4_ * -0.5 * auVar142._12_4_;
                  auVar210._16_4_ = auVar70._16_4_ * -0.5 * 0.0;
                  auVar210._20_4_ = auVar70._20_4_ * -0.5 * 0.0;
                  auVar210._28_36_ = auVar206._28_36_;
                  auVar210._24_4_ = auVar70._24_4_ * -0.5 * 0.0;
                  auVar63 = auVar210._0_32_;
                  auVar194._0_4_ = auVar210._0_4_ * -auVar190._0_4_;
                  auVar194._4_4_ = auVar210._4_4_ * -auVar190._4_4_;
                  auVar194._8_4_ = auVar210._8_4_ * -auVar190._8_4_;
                  auVar194._12_4_ = auVar210._12_4_ * -auVar190._12_4_;
                  auVar194._16_4_ = auVar210._16_4_ * -auVar190._16_4_;
                  auVar194._20_4_ = auVar210._20_4_ * -auVar190._20_4_;
                  auVar194._28_36_ = auVar190._28_36_;
                  auVar194._24_4_ = auVar210._24_4_ * -auVar190._24_4_;
                  auVar116 = auVar194._0_32_;
                }
                auVar142 = auVar116._0_16_;
                auVar100 = auVar63._0_16_;
                if (*(int *)(&this->field_0xd8 + (long)pp_Var3[-3]) == 0) {
                  auVar178 = auVar100;
                  auVar167 = auVar142;
                  if (!bVar9) {
                    auVar178 = vshufps_avx(auVar100,auVar100,0);
                    auVar167 = vshufps_avx(auVar142,auVar142,0);
                  }
                  if (!bVar8) {
                    auVar63._16_16_ = auVar178;
                    auVar63._0_16_ = auVar178;
                    auVar116._16_16_ = auVar167;
                    auVar116._0_16_ = auVar167;
                  }
                  uVar17 = 0;
                  if (7 < (int)uVar21) {
                    iVar13 = 8;
                    do {
                      auVar186 = vfmadd132ps_fma(*pauVar27,auVar116,auVar63);
                      *pauVar27 = ZEXT1632(auVar186);
                      pauVar27 = pauVar27 + 1;
                      iVar13 = iVar13 + 8;
                      uVar17 = uVar25;
                    } while (iVar13 <= (int)uVar21);
                  }
                  uVar23 = uVar17 | 4;
                  while ((int)uVar23 <= (int)uVar21) {
                    auVar186 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar27,auVar167,auVar178);
                    *(undefined1 (*) [16])*pauVar27 = auVar186;
                    pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
                    uVar23 = uVar17 + 8;
                    uVar17 = uVar17 + 4;
                  }
                  if ((int)uVar17 < (int)uVar21) {
                    uVar20 = CONCAT44(0,~uVar17 + uVar21);
                    auVar44._8_8_ = 0;
                    auVar44._0_8_ = uVar20;
                    auVar178 = vpshufd_avx(auVar44,0x44);
                    auVar100 = vshufps_avx(auVar100,auVar100,0);
                    auVar203._16_16_ = auVar100;
                    auVar203._0_16_ = auVar100;
                    auVar142 = vshufps_avx(auVar142,auVar142,0);
                    auVar188._16_16_ = auVar142;
                    auVar188._0_16_ = auVar142;
                    auVar142 = vorps_avx(auVar178,auVar176);
                    auVar100 = vorps_avx(auVar178,auVar176);
                    uVar18 = 0;
                    do {
                      auVar89._8_8_ = 0;
                      auVar89._0_8_ = uVar18;
                      auVar167 = vpshufd_avx(auVar89,0x44);
                      auVar117._16_16_ = auVar167;
                      auVar117._0_16_ = auVar167;
                      auVar70 = vorps_avx(auVar266._0_32_,auVar117);
                      auVar71 = vorps_avx(auVar117,auVar174._0_32_);
                      auVar167 = vorps_avx(auVar178,auVar176);
                      auVar215._0_8_ = auVar71._16_8_ ^ 0x8000000000000000;
                      auVar215._8_4_ = auVar71._24_4_;
                      auVar215._12_4_ = auVar71._28_4_ ^ 0x80000000;
                      auVar186 = vpcmpgtq_avx(auVar215,auVar167);
                      auVar90._0_8_ = auVar71._0_8_ ^ 0x8000000000000000;
                      auVar90._8_4_ = auVar71._8_4_;
                      auVar90._12_4_ = auVar71._12_4_ ^ 0x80000000;
                      auVar150 = vpcmpgtq_avx(auVar90,auVar142);
                      auVar186 = vpackssdw_avx(auVar150,auVar186);
                      auVar216._0_8_ = auVar70._16_8_ ^ 0x8000000000000000;
                      auVar216._8_4_ = auVar70._24_4_;
                      auVar216._12_4_ = auVar70._28_4_ ^ 0x80000000;
                      auVar167 = vpcmpgtq_avx(auVar216,auVar167);
                      auVar152._0_8_ = auVar70._0_8_ ^ 0x8000000000000000;
                      auVar152._8_4_ = auVar70._8_4_;
                      auVar152._12_4_ = auVar70._12_4_ ^ 0x80000000;
                      auVar150 = vpcmpgtq_avx(auVar152,auVar100);
                      auVar167 = vpackssdw_avx(auVar150,auVar167);
                      auVar174 = ZEXT3264(_DAT_00516ce0);
                      auVar167 = vpackssdw_avx(auVar167 ^ auVar140,auVar186 ^ auVar140);
                      auVar186 = vpmovsxwd_avx(auVar167);
                      auVar167 = vpunpckhwd_avx(auVar167,auVar167);
                      auVar118._16_16_ = auVar167;
                      auVar118._0_16_ = auVar186;
                      auVar70 = vmaskmovps_avx(auVar118,*(undefined1 (*) [32])
                                                         (*pauVar27 + uVar18 * 4));
                      auVar167 = vfmadd213ps_fma(auVar70,auVar203,auVar188);
                      auVar70 = vmaskmovps_avx(auVar118,ZEXT1632(auVar167));
                      *(undefined1 (*) [32])(*pauVar27 + uVar18 * 4) = auVar70;
                      uVar18 = uVar18 + 8;
                    } while ((uVar20 + 8 & 0x1fffffff8) != uVar18);
                  }
                }
                else {
                  pauVar12 = pauVar24;
                  pauVar19 = pauVar16;
                  if ((bool)(bVar8 & 7 < (int)uVar21)) {
                    iVar13 = 8;
                    do {
                      uVar1 = *(undefined4 *)*pauVar12;
                      auVar60._4_4_ = uVar1;
                      auVar60._0_4_ = uVar1;
                      auVar60._8_4_ = uVar1;
                      auVar60._12_4_ = uVar1;
                      auVar60._16_4_ = uVar1;
                      auVar60._20_4_ = uVar1;
                      auVar60._24_4_ = uVar1;
                      auVar60._28_4_ = uVar1;
                      uVar1 = *(undefined4 *)*pauVar19;
                      auVar113._4_4_ = uVar1;
                      auVar113._0_4_ = uVar1;
                      auVar113._8_4_ = uVar1;
                      auVar113._12_4_ = uVar1;
                      auVar113._16_4_ = uVar1;
                      auVar113._20_4_ = uVar1;
                      auVar113._24_4_ = uVar1;
                      auVar113._28_4_ = uVar1;
                      auVar178 = vfmadd132ps_fma(*pauVar27,auVar116,auVar63);
                      auVar178 = vfmadd213ps_fma(ZEXT1632(auVar178),auVar60,auVar113);
                      *pauVar27 = ZEXT1632(auVar178);
                      pauVar27 = pauVar27 + 1;
                      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 4);
                      pauVar19 = (undefined1 (*) [32])(*pauVar19 + 4);
                      iVar13 = iVar13 + 8;
                    } while (iVar13 <= (int)uVar21);
                  }
                  if (bVar9) {
                    iVar13 = 4;
                    if (7 < (int)uVar21) {
                      auVar61._16_16_ = auVar100;
                      auVar61._0_16_ = auVar100;
                      auVar146._16_16_ = auVar142;
                      auVar146._0_16_ = auVar142;
                      iVar13 = 8;
                      do {
                        uVar1 = *(undefined4 *)*pauVar12;
                        auVar114._4_4_ = uVar1;
                        auVar114._0_4_ = uVar1;
                        auVar114._8_4_ = uVar1;
                        auVar114._12_4_ = uVar1;
                        uVar1 = *(undefined4 *)(*pauVar12 + 4);
                        auVar114._20_4_ = uVar1;
                        auVar114._16_4_ = uVar1;
                        auVar114._24_4_ = uVar1;
                        auVar114._28_4_ = uVar1;
                        uVar1 = *(undefined4 *)*pauVar19;
                        auVar157._4_4_ = uVar1;
                        auVar157._0_4_ = uVar1;
                        auVar157._8_4_ = uVar1;
                        auVar157._12_4_ = uVar1;
                        uVar1 = *(undefined4 *)(*pauVar19 + 4);
                        auVar157._20_4_ = uVar1;
                        auVar157._16_4_ = uVar1;
                        auVar157._24_4_ = uVar1;
                        auVar157._28_4_ = uVar1;
                        auVar178 = vfmadd132ps_fma(*pauVar27,auVar146,auVar61);
                        auVar178 = vfmadd213ps_fma(ZEXT1632(auVar178),auVar114,auVar157);
                        *pauVar27 = ZEXT1632(auVar178);
                        pauVar27 = pauVar27 + 1;
                        pauVar12 = (undefined1 (*) [32])(*pauVar12 + 8);
                        pauVar19 = (undefined1 (*) [32])(*pauVar19 + 8);
                        iVar13 = iVar13 + 8;
                      } while (iVar13 <= (int)uVar21);
                      auVar174 = ZEXT3264(_DAT_00516ce0);
                      iVar13 = uVar25 + 4;
                    }
                    for (; iVar13 <= (int)uVar21; iVar13 = iVar13 + 4) {
                      uVar1 = *(undefined4 *)*pauVar12;
                      auVar43._4_4_ = uVar1;
                      auVar43._0_4_ = uVar1;
                      auVar43._8_4_ = uVar1;
                      auVar43._12_4_ = uVar1;
                      uVar1 = *(undefined4 *)*pauVar19;
                      auVar88._4_4_ = uVar1;
                      auVar88._0_4_ = uVar1;
                      auVar88._8_4_ = uVar1;
                      auVar88._12_4_ = uVar1;
                      auVar178 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar27,auVar142,auVar100);
                      auVar178 = vfmadd213ps_fma(auVar178,auVar43,auVar88);
                      *(undefined1 (*) [16])*pauVar27 = auVar178;
                      pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
                      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 4);
                      pauVar19 = (undefined1 (*) [32])(*pauVar19 + 4);
                    }
                  }
                  if (bVar10) {
                    auVar178 = vshufps_avx(auVar100,auVar100,0);
                    auVar167 = vshufps_avx(auVar142,auVar142,0);
                    uVar17 = 0;
                    if (7 < (int)uVar21) {
                      auVar62._16_16_ = auVar178;
                      auVar62._0_16_ = auVar178;
                      auVar115._16_16_ = auVar167;
                      auVar115._0_16_ = auVar167;
                      iVar13 = 8;
                      do {
                        auVar186 = vfmadd132ps_fma(*pauVar27,auVar115,auVar62);
                        auVar186 = vfmadd213ps_fma(ZEXT1632(auVar186),*pauVar12,*pauVar19);
                        *pauVar27 = ZEXT1632(auVar186);
                        pauVar27 = pauVar27 + 1;
                        pauVar12 = pauVar12 + 1;
                        pauVar19 = pauVar19 + 1;
                        iVar13 = iVar13 + 8;
                        uVar17 = uVar25;
                      } while (iVar13 <= (int)uVar21);
                    }
                    uVar23 = uVar17 | 4;
                    while ((int)uVar23 <= (int)uVar21) {
                      auVar186 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar27,auVar167,auVar178);
                      auVar186 = vfmadd213ps_fma(auVar186,*(undefined1 (*) [16])*pauVar12,
                                                 *(undefined1 (*) [16])*pauVar19);
                      *(undefined1 (*) [16])*pauVar27 = auVar186;
                      pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
                      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
                      pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
                      uVar23 = uVar17 + 8;
                      uVar17 = uVar17 + 4;
                    }
                    if (uVar21 - uVar17 != 0 && (int)uVar17 <= (int)uVar21) {
                      lVar11 = 0;
                      do {
                        auVar178 = vfmadd132ss_fma(ZEXT416(*(uint *)(*pauVar27 + lVar11 * 4)),
                                                   auVar142,auVar100);
                        auVar178 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar12 + lVar11 * 4)),
                                                   auVar178,ZEXT416(*(uint *)(*pauVar19 + lVar11 * 4
                                                                             )));
                        *(int *)(*pauVar27 + lVar11 * 4) = auVar178._0_4_;
                        lVar11 = lVar11 + 1;
                      } while (uVar21 - uVar17 != (int)lVar11);
                    }
                  }
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar22);
            }
            local_f8 = local_f8 + 1;
          } while (local_f8 != uVar15);
        }
      }
      else if (0 < (int)uVar15) {
        uVar21 = uVar22 * iVar2 * iVar14;
        fVar28 = 1.0 / (float)(int)(uVar22 * iVar2);
        auVar99 = vshufps_avx(ZEXT416((uint)fVar28),ZEXT416((uint)fVar28),0);
        uVar22 = uVar21 & 0xfffffff8;
        uVar26 = 0;
        auVar266 = ZEXT3264(_DAT_00516cc0);
        auVar174 = ZEXT3264(_DAT_00516ce0);
        auVar177._8_8_ = 0x8000000000000000;
        auVar177._0_8_ = 0x8000000000000000;
        auVar140 = vpcmpeqd_avx(auVar140,auVar140);
        do {
          pauVar27 = (undefined1 (*) [32])
                     (bottom_top_blob->cstep * uVar26 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          auVar190 = ZEXT1664(ZEXT816(0) << 0x40);
          pauVar12 = pauVar27;
          uVar25 = 0;
          if (7 < (int)uVar21) {
            iVar13 = 8;
            do {
              auVar190 = ZEXT3264(CONCAT428(auVar190._28_4_ + *(float *)(*pauVar12 + 0x1c),
                                            CONCAT424(auVar190._24_4_ + *(float *)(*pauVar12 + 0x18)
                                                      ,CONCAT420(auVar190._20_4_ +
                                                                 *(float *)(*pauVar12 + 0x14),
                                                                 CONCAT416(auVar190._16_4_ +
                                                                           *(float *)(*pauVar12 +
                                                                                     0x10),
                                                                           CONCAT412(auVar190._12_4_
                                                                                     + *(float *)(*
                                                  pauVar12 + 0xc),
                                                  CONCAT48(auVar190._8_4_ +
                                                           *(float *)(*pauVar12 + 8),
                                                           CONCAT44(auVar190._4_4_ +
                                                                    *(float *)(*pauVar12 + 4),
                                                                    auVar190._0_4_ +
                                                                    *(float *)*pauVar12))))))));
              pauVar12 = pauVar12 + 1;
              iVar13 = iVar13 + 8;
              uVar25 = uVar22;
            } while (iVar13 <= (int)uVar21);
          }
          uVar17 = uVar25 | 4;
          auVar200 = ZEXT816(0) << 0x40;
          while( true ) {
            fVar30 = auVar200._0_4_;
            fVar73 = auVar200._4_4_;
            fVar74 = auVar200._8_4_;
            fVar75 = auVar200._12_4_;
            if ((int)uVar21 < (int)uVar17) break;
            auVar200._0_4_ = fVar30 + *(float *)*pauVar12;
            auVar200._4_4_ = fVar73 + *(float *)(*pauVar12 + 4);
            auVar200._8_4_ = fVar74 + *(float *)(*pauVar12 + 8);
            auVar200._12_4_ = fVar75 + *(float *)(*pauVar12 + 0xc);
            pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
            uVar17 = uVar25 + 8;
            uVar25 = uVar25 + 4;
          }
          auVar142 = ZEXT816(0) << 0x20;
          fVar29 = 0.0;
          auVar70 = auVar266._0_32_;
          if ((int)uVar25 < (int)uVar21) {
            uVar20 = CONCAT44(0,~uVar25 + uVar21);
            auVar45._8_8_ = 0;
            auVar45._0_8_ = uVar20;
            auVar178 = vpshufd_avx(auVar45,0x44);
            auVar142 = vorps_avx(auVar178,auVar177);
            auVar100 = vorps_avx(auVar178,auVar177);
            uVar18 = 0;
            auVar160 = ZEXT1664(ZEXT816(0) << 0x40);
            do {
              auVar206 = auVar160;
              auVar91._8_8_ = 0;
              auVar91._0_8_ = uVar18;
              auVar167 = vpshufd_avx(auVar91,0x44);
              auVar119._16_16_ = auVar167;
              auVar119._0_16_ = auVar167;
              auVar71 = vorps_avx(auVar70,auVar119);
              auVar241 = vorps_avx(auVar119,auVar174._0_32_);
              auVar167 = vorps_avx(auVar178,auVar177);
              auVar228._8_4_ = auVar241._24_4_;
              auVar228._0_8_ = auVar241._16_8_ ^ 0x8000000000000000;
              auVar228._12_4_ = auVar241._28_4_ ^ 0x80000000;
              auVar150 = vpcmpgtq_avx(auVar228,auVar167);
              auVar92._8_4_ = auVar241._8_4_;
              auVar246._8_4_ = auVar92._8_4_;
              auVar246._0_8_ = auVar241._0_8_ ^ 0x8000000000000000;
              auVar246._12_4_ = auVar241._12_4_ ^ 0x80000000;
              auVar186 = vpcmpgtq_avx(auVar246,auVar142);
              auVar186 = vpackssdw_avx(auVar186,auVar150);
              auVar258._0_8_ = auVar71._16_8_ ^ 0x8000000000000000;
              auVar258._8_4_ = auVar71._24_4_;
              auVar258._12_4_ = auVar71._28_4_ ^ 0x80000000;
              auVar141 = vpcmpgtq_avx(auVar258,auVar167);
              auVar259._0_8_ = auVar71._0_8_ ^ 0x8000000000000000;
              auVar259._8_4_ = auVar71._8_4_;
              auVar259._12_4_ = auVar71._12_4_ ^ 0x80000000;
              auVar167 = vpcmpgtq_avx(auVar259,auVar100);
              auVar167 = vpackssdw_avx(auVar167,auVar141);
              auVar167 = vpackssdw_avx(auVar167 ^ auVar140,auVar186 ^ auVar140);
              auVar186 = vpmovsxwd_avx(auVar167);
              auVar167 = vpunpckhwd_avx(auVar167,auVar167);
              auVar251._16_16_ = auVar167;
              auVar251._0_16_ = auVar186;
              auVar159 = vmaskmovps_avx(auVar251,*(undefined1 (*) [32])(*pauVar12 + uVar18 * 4));
              auVar232._0_4_ = auVar159._0_4_ + auVar206._0_4_;
              auVar232._4_4_ = auVar159._4_4_ + auVar206._4_4_;
              auVar232._8_4_ = auVar159._8_4_ + auVar206._8_4_;
              auVar232._12_4_ = auVar159._12_4_ + auVar206._12_4_;
              auVar237._16_4_ = auVar159._16_4_ + auVar206._16_4_;
              auVar237._0_16_ = auVar232;
              auVar237._20_4_ = auVar159._20_4_ + auVar206._20_4_;
              auVar237._24_4_ = auVar159._24_4_ + auVar206._24_4_;
              auVar237._28_4_ = auVar159._28_4_ + auVar206._28_4_;
              uVar18 = uVar18 + 8;
              auVar160 = ZEXT3264(auVar237);
            } while ((uVar20 + 8 & 0x1fffffff8) != uVar18);
            auVar142 = vorps_avx(auVar178,auVar177);
            auVar92._0_8_ = auVar241._0_8_ ^ 0x8000000000000000;
            auVar92._12_4_ = auVar241._12_4_ ^ 0x80000000;
            auVar142 = vpcmpgtq_avx(auVar92,auVar142);
            auVar100 = vpackssdw_avx(auVar142,auVar150);
            auVar142 = vorps_avx(auVar178,auVar177);
            auVar136._0_8_ = auVar71._0_8_ ^ 0x8000000000000000;
            auVar136._8_4_ = auVar71._8_4_;
            auVar136._12_4_ = auVar71._12_4_ ^ 0x80000000;
            auVar142 = vpcmpgtq_avx(auVar136,auVar142);
            auVar142 = vpackssdw_avx(auVar142,auVar141);
            auVar142 = vblendvps_avx(auVar206._0_16_,auVar232,auVar142 ^ auVar140);
            auVar100 = vblendvps_avx(auVar206._16_16_,auVar237._16_16_,auVar100 ^ auVar140);
            auVar142 = vhaddps_avx(auVar100,auVar142);
            auVar142 = vhaddps_avx(auVar142,auVar142);
            auVar142 = vhaddps_avx(auVar142,auVar142);
            fVar29 = auVar142._0_4_;
            auVar142 = ZEXT816(0);
          }
          auVar160 = ZEXT1664(auVar142 << 0x20);
          local_b8 = auVar99._0_4_;
          fStack_b4 = auVar99._4_4_;
          fStack_b0 = auVar99._8_4_;
          fStack_ac = auVar99._12_4_;
          if (iVar14 == 8) {
            auVar185._0_4_ = auVar190._0_4_ * local_b8;
            auVar185._4_4_ = auVar190._4_4_ * fStack_b4;
            auVar185._8_4_ = auVar190._8_4_ * fStack_b0;
            auVar185._12_4_ = auVar190._12_4_ * fStack_ac;
            auVar160._16_4_ = auVar190._16_4_ * local_b8;
            auVar160._0_16_ = auVar185;
            auVar160._20_4_ = auVar190._20_4_ * fStack_b4;
            auVar160._28_36_ = auVar190._28_36_;
            auVar160._24_4_ = auVar190._24_4_ * fStack_b0;
            auVar64 = auVar160._0_32_;
            auVar190 = ZEXT3264(auVar64);
            auVar201 = vshufps_avx(auVar185,auVar185,0);
            bVar8 = true;
            bVar10 = false;
            auVar160 = ZEXT1664(auVar185);
            bVar9 = false;
          }
          else {
            if (iVar14 == 4) {
              auVar201._0_4_ = (fVar30 + auVar190._16_4_ + auVar190._0_4_) * local_b8;
              auVar201._4_4_ = (fVar73 + auVar190._20_4_ + auVar190._4_4_) * fStack_b4;
              auVar201._8_4_ = (fVar74 + auVar190._24_4_ + auVar190._8_4_) * fStack_b0;
              auVar201._12_4_ = (fVar75 + auVar190._28_4_ + auVar190._12_4_) * fStack_ac;
              bVar9 = true;
              bVar10 = false;
              auVar160 = ZEXT1664(auVar201);
              auVar142 = auVar201;
            }
            else {
              if (iVar14 != 1) {
                auVar142 = ZEXT816(0);
                auVar201 = ZEXT816(0) << 0x40;
              }
              else {
                auVar100 = vshufpd_avx(auVar200,auVar200,1);
                auVar142 = vhaddps_avx(auVar190._16_16_,auVar190._0_16_);
                auVar137._0_4_ = fVar30 + auVar100._0_4_;
                auVar137._4_4_ = fVar73 + auVar100._4_4_;
                auVar137._8_4_ = fVar74 + auVar100._8_4_;
                auVar137._12_4_ = fVar75 + auVar100._12_4_;
                auVar142 = vhaddps_avx(auVar142,auVar142);
                auVar100 = vmovshdup_avx(auVar137);
                auVar142 = vhaddps_avx(auVar142,auVar142);
                fVar30 = (auVar142._0_4_ + auVar100._0_4_ + auVar137._0_4_ + fVar29) * fVar28;
                auVar160 = ZEXT464((uint)fVar30);
                auVar142 = vblendps_avx(ZEXT416((uint)fVar30),_DAT_00514070,0xe);
                auVar201 = vshufps_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30),0);
              }
              bVar10 = iVar14 == 1;
              bVar9 = false;
            }
            auVar190 = ZEXT1664(auVar142);
            auVar64._16_16_ = auVar201;
            auVar64._0_16_ = auVar201;
            bVar8 = false;
          }
          auVar212 = (undefined1  [36])0x0;
          pauVar12 = pauVar27;
          if ((int)uVar21 < 8) {
            auVar71 = SUB6432(ZEXT864(0),0);
            uVar25 = 0;
          }
          else {
            auVar206 = ZEXT864(0);
            iVar13 = 8;
            do {
              auVar71 = vsubps_avx(*pauVar12,auVar64);
              auVar142 = vfmadd231ps_fma(auVar206._0_32_,auVar71,auVar71);
              auVar206 = ZEXT1664(auVar142);
              auVar71 = ZEXT1632(auVar142);
              pauVar12 = pauVar12 + 1;
              iVar13 = iVar13 + 8;
              uVar25 = uVar22;
            } while (iVar13 <= (int)uVar21);
          }
          auVar142 = ZEXT816(0) << 0x40;
          uVar17 = uVar25 | 4;
          while ((int)uVar17 <= (int)uVar21) {
            auVar100 = vsubps_avx(*(undefined1 (*) [16])*pauVar12,auVar201);
            auVar142 = vfmadd231ps_fma(auVar142,auVar100,auVar100);
            pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
            uVar17 = uVar25 + 8;
            uVar25 = uVar25 + 4;
          }
          fVar30 = 0.0;
          if ((int)uVar25 < (int)uVar21) {
            uVar20 = CONCAT44(0,~uVar25 + uVar21);
            auVar46._8_8_ = 0;
            auVar46._0_8_ = uVar20;
            auVar167 = vpshufd_avx(auVar46,0x44);
            auVar212 = ZEXT436(auVar167._12_4_);
            auVar150 = auVar160._0_16_;
            auVar100 = vshufps_avx(auVar150,auVar150,0);
            auVar265._16_16_ = auVar100;
            auVar265._0_16_ = auVar100;
            auVar100 = vorps_avx(auVar167,auVar177);
            auVar178 = vorps_avx(auVar167,auVar177);
            uVar18 = 0;
            auVar186 = ZEXT416(0) << 0x40;
            do {
              auVar248 = auVar186;
              auVar93._8_8_ = 0;
              auVar93._0_8_ = uVar18;
              auVar186 = vpshufd_avx(auVar93,0x44);
              auVar120._16_16_ = auVar186;
              auVar120._0_16_ = auVar186;
              auVar241 = vorps_avx(auVar120,auVar70);
              auVar159 = vorps_avx(auVar120,auVar174._0_32_);
              auVar186 = vorps_avx(auVar167,auVar177);
              auVar240._0_8_ = auVar159._16_8_ ^ 0x8000000000000000;
              auVar240._8_4_ = auVar159._24_4_;
              auVar240._12_4_ = auVar159._28_4_ ^ 0x80000000;
              auVar154 = vpcmpgtq_avx(auVar240,auVar186);
              auVar260._0_8_ = auVar159._0_8_ ^ 0x8000000000000000;
              auVar94._8_4_ = auVar159._8_4_;
              auVar260._8_4_ = auVar94._8_4_;
              auVar260._12_4_ = auVar159._12_4_ ^ 0x80000000;
              auVar141 = vpcmpgtq_avx(auVar260,auVar100);
              auVar141 = vpackssdw_avx(auVar141,auVar154);
              auVar165._0_8_ = auVar241._16_8_ ^ 0x8000000000000000;
              auVar165._8_4_ = auVar241._24_4_;
              auVar165._12_4_ = auVar241._28_4_ ^ 0x80000000;
              auVar219 = vpcmpgtq_avx(auVar165,auVar186);
              auVar166._0_8_ = auVar241._0_8_ ^ 0x8000000000000000;
              auVar138._8_4_ = auVar241._8_4_;
              auVar166._8_4_ = auVar138._8_4_;
              auVar166._12_4_ = auVar241._12_4_ ^ 0x80000000;
              auVar186 = vpcmpgtq_avx(auVar166,auVar178);
              auVar186 = vpackssdw_avx(auVar186,auVar219);
              auVar186 = vpackssdw_avx(auVar186 ^ auVar140,auVar141 ^ auVar140);
              auVar141 = vpmovsxwd_avx(auVar186);
              auVar186 = vpunpckhwd_avx(auVar186,auVar186);
              auVar172._16_16_ = auVar186;
              auVar172._0_16_ = auVar141;
              auVar149 = vmaskmovps_avx(auVar172,*(undefined1 (*) [32])(*pauVar12 + uVar18 * 4));
              auVar149 = vsubps_avx(auVar149,auVar265);
              auVar174 = ZEXT3264(_DAT_00516ce0);
              auVar186 = vfmadd213ps_fma(auVar149,auVar149,ZEXT1632(auVar248));
              uVar18 = uVar18 + 8;
            } while ((uVar20 + 8 & 0x1fffffff8) != uVar18);
            auVar100 = vorps_avx(auVar167,auVar177);
            auVar94._0_8_ = auVar159._0_8_ ^ 0x8000000000000000;
            auVar94._12_4_ = auVar159._12_4_ ^ 0x80000000;
            auVar100 = vpcmpgtq_avx(auVar94,auVar100);
            auVar178 = vpackssdw_avx(auVar100,auVar154);
            auVar100 = vorps_avx(auVar167,auVar177);
            auVar138._0_8_ = auVar241._0_8_ ^ 0x8000000000000000;
            auVar138._12_4_ = auVar241._12_4_ ^ 0x80000000;
            auVar100 = vpcmpgtq_avx(auVar138,auVar100);
            auVar100 = vpackssdw_avx(auVar100,auVar219);
            auVar100 = vblendvps_avx(auVar248,auVar186,auVar100 ^ auVar140);
            auVar178 = vblendvps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,auVar178 ^ auVar140
                                    );
            auVar100 = vhaddps_avx(auVar178,auVar100);
            auVar100 = vhaddps_avx(auVar100,auVar100);
            auVar100 = vhaddps_avx(auVar100,auVar100);
            fVar30 = auVar100._0_4_;
            auVar266 = ZEXT3264(auVar70);
            auVar190 = ZEXT3264(auVar190._0_32_);
            auVar160 = ZEXT1664(auVar150);
          }
          auVar100 = ZEXT416((uint)*(float *)(&this->field_0xd4 + (long)pp_Var3[-3]));
          auVar124 = auVar190._0_32_;
          if (bVar8) {
            auVar206._0_4_ = auVar71._0_4_ * local_b8;
            auVar206._4_4_ = auVar71._4_4_ * fStack_b4;
            auVar206._8_4_ = auVar71._8_4_ * fStack_b0;
            auVar206._12_4_ = auVar71._12_4_ * fStack_ac;
            auVar206._16_4_ = auVar71._16_4_ * local_b8;
            auVar206._20_4_ = auVar71._20_4_ * fStack_b4;
            auVar206._24_4_ = auVar71._24_4_ * fStack_b0;
            auVar206._28_36_ = auVar212;
            auVar206 = ZEXT3264(auVar206._0_32_);
          }
          else {
            auVar206 = ZEXT1664(ZEXT816(0) << 0x40);
          }
          auVar247 = auVar142;
          if (bVar9) {
            auVar247._0_4_ = auVar142._0_4_ + auVar71._0_4_ + auVar71._16_4_;
            auVar247._4_4_ = auVar142._4_4_ + auVar71._4_4_ + auVar71._20_4_;
            auVar247._8_4_ = auVar142._8_4_ + auVar71._8_4_ + auVar71._24_4_;
            auVar247._12_4_ = auVar142._12_4_ + auVar71._12_4_ + auVar71._28_4_;
            auVar70 = vblendps_avx(auVar206._0_32_,
                                   ZEXT1632(CONCAT412(auVar247._12_4_ * fStack_ac,
                                                      CONCAT48(auVar247._8_4_ * fStack_b0,
                                                               CONCAT44(auVar247._4_4_ * fStack_b4,
                                                                        auVar247._0_4_ * local_b8)))
                                           ),0xf);
            auVar206 = ZEXT3264(auVar70);
          }
          if (bVar10) {
            auVar142 = vshufpd_avx(auVar247,auVar247,1);
            auVar95._0_4_ = auVar247._0_4_ + auVar142._0_4_;
            auVar95._4_4_ = auVar247._4_4_ + auVar142._4_4_;
            auVar95._8_4_ = auVar247._8_4_ + auVar142._8_4_;
            auVar95._12_4_ = auVar247._12_4_ + auVar142._12_4_;
            auVar142 = vhaddps_avx(auVar71._16_16_,auVar71._0_16_);
            auVar178 = vmovshdup_avx(auVar95);
            auVar142 = vhaddps_avx(auVar142,auVar142);
            auVar142 = vhaddps_avx(auVar142,auVar142);
            auVar70 = vblendps_avx(auVar206._0_32_,
                                   ZEXT432((uint)((fVar30 + auVar142._0_4_ + auVar178._0_4_ +
                                                  auVar95._0_4_) * fVar28)),1);
            auVar206 = ZEXT3264(auVar70);
          }
          fVar30 = auVar206._0_4_;
          auVar69 = auVar206._0_32_;
          if (iVar14 == 1) {
            fVar30 = fVar30 + *(float *)(&this->field_0xd4 + (long)pp_Var3[-3]);
            auVar142 = vrsqrtss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30));
            auVar100 = vfmadd213ss_fma(ZEXT416((uint)(fVar30 * auVar142._0_4_)),auVar142,
                                       ZEXT416(0xc0400000));
            fVar30 = auVar142._0_4_ * -0.5 * auVar100._0_4_;
            auVar69 = vblendps_avx(auVar69,ZEXT432((uint)fVar30),1);
            auVar124 = vblendps_avx(auVar124,ZEXT432((uint)(fVar30 * -auVar160._0_4_)),1);
          }
          else if (iVar14 == 4) {
            auVar142 = vshufps_avx(auVar100,auVar100,0);
            auVar47._0_4_ = fVar30 + auVar142._0_4_;
            auVar47._4_4_ = auVar206._4_4_ + auVar142._4_4_;
            auVar47._8_4_ = auVar206._8_4_ + auVar142._8_4_;
            auVar47._12_4_ = auVar206._12_4_ + auVar142._12_4_;
            auVar142 = vrsqrtps_avx(auVar47);
            auVar48._0_4_ = auVar47._0_4_ * auVar142._0_4_;
            auVar48._4_4_ = auVar47._4_4_ * auVar142._4_4_;
            auVar48._8_4_ = auVar47._8_4_ * auVar142._8_4_;
            auVar48._12_4_ = auVar47._12_4_ * auVar142._12_4_;
            auVar139._8_4_ = 0xc0400000;
            auVar139._0_8_ = 0xc0400000c0400000;
            auVar139._12_4_ = 0xc0400000;
            auVar100 = vfmadd213ps_fma(auVar48,auVar142,auVar139);
            fVar30 = auVar142._0_4_ * -0.5 * auVar100._0_4_;
            fVar73 = auVar142._4_4_ * -0.5 * auVar100._4_4_;
            fVar74 = auVar142._8_4_ * -0.5 * auVar100._8_4_;
            fVar75 = auVar142._12_4_ * -0.5 * auVar100._12_4_;
            auVar69 = vblendps_avx(auVar69,ZEXT1632(CONCAT412(fVar75,CONCAT48(fVar74,CONCAT44(fVar73
                                                  ,fVar30)))),0xf);
            auVar124 = vblendps_avx(auVar124,ZEXT1632(CONCAT412(fVar75 * -auVar190._12_4_,
                                                                CONCAT48(fVar74 * -auVar190._8_4_,
                                                                         CONCAT44(fVar73 * -auVar190
                                                  ._4_4_,fVar30 * -auVar190._0_4_)))),0xf);
          }
          else if (iVar14 == 8) {
            auVar142 = vshufps_avx(auVar100,auVar100,0);
            auVar65._0_4_ = fVar30 + auVar142._0_4_;
            auVar65._4_4_ = auVar206._4_4_ + auVar142._4_4_;
            auVar65._8_4_ = auVar206._8_4_ + auVar142._8_4_;
            auVar65._12_4_ = auVar206._12_4_ + auVar142._12_4_;
            auVar65._16_4_ = auVar206._16_4_ + auVar142._0_4_;
            auVar65._20_4_ = auVar206._20_4_ + auVar142._4_4_;
            auVar65._24_4_ = auVar206._24_4_ + auVar142._8_4_;
            auVar65._28_4_ = auVar206._28_4_ + auVar142._12_4_;
            auVar70 = vrsqrtps_avx(auVar65);
            auVar7._4_4_ = auVar65._4_4_ * auVar70._4_4_;
            auVar7._0_4_ = auVar65._0_4_ * auVar70._0_4_;
            auVar7._8_4_ = auVar65._8_4_ * auVar70._8_4_;
            auVar7._12_4_ = auVar65._12_4_ * auVar70._12_4_;
            auVar7._16_4_ = auVar65._16_4_ * auVar70._16_4_;
            auVar7._20_4_ = auVar65._20_4_ * auVar70._20_4_;
            auVar7._24_4_ = auVar65._24_4_ * auVar70._24_4_;
            auVar7._28_4_ = auVar65._28_4_;
            auVar147._8_4_ = 0xc0400000;
            auVar147._0_8_ = 0xc0400000c0400000;
            auVar147._12_4_ = 0xc0400000;
            auVar147._16_4_ = 0xc0400000;
            auVar147._20_4_ = 0xc0400000;
            auVar147._24_4_ = 0xc0400000;
            auVar147._28_4_ = 0xc0400000;
            auVar142 = vfmadd213ps_fma(auVar7,auVar70,auVar147);
            auVar211._0_4_ = auVar70._0_4_ * -0.5 * auVar142._0_4_;
            auVar211._4_4_ = auVar70._4_4_ * -0.5 * auVar142._4_4_;
            auVar211._8_4_ = auVar70._8_4_ * -0.5 * auVar142._8_4_;
            auVar211._12_4_ = auVar70._12_4_ * -0.5 * auVar142._12_4_;
            auVar211._16_4_ = auVar70._16_4_ * -0.5 * 0.0;
            auVar211._20_4_ = auVar70._20_4_ * -0.5 * 0.0;
            auVar211._28_36_ = auVar206._28_36_;
            auVar211._24_4_ = auVar70._24_4_ * -0.5 * 0.0;
            auVar69 = auVar211._0_32_;
            auVar195._0_4_ = auVar211._0_4_ * -auVar190._0_4_;
            auVar195._4_4_ = auVar211._4_4_ * -auVar190._4_4_;
            auVar195._8_4_ = auVar211._8_4_ * -auVar190._8_4_;
            auVar195._12_4_ = auVar211._12_4_ * -auVar190._12_4_;
            auVar195._16_4_ = auVar211._16_4_ * -auVar190._16_4_;
            auVar195._20_4_ = auVar211._20_4_ * -auVar190._20_4_;
            auVar195._28_36_ = auVar190._28_36_;
            auVar195._24_4_ = auVar211._24_4_ * -auVar190._24_4_;
            auVar124 = auVar195._0_32_;
          }
          auVar142 = auVar124._0_16_;
          auVar100 = auVar69._0_16_;
          if (*(int *)(&this->field_0xd8 + (long)pp_Var3[-3]) == 0) {
            auVar178 = auVar100;
            auVar167 = auVar142;
            if (!bVar9) {
              auVar178 = vshufps_avx(auVar100,auVar100,0);
              auVar167 = vshufps_avx(auVar142,auVar142,0);
            }
            if (!bVar8) {
              auVar69._16_16_ = auVar178;
              auVar69._0_16_ = auVar178;
              auVar124._16_16_ = auVar167;
              auVar124._0_16_ = auVar167;
            }
            uVar25 = 0;
            if (7 < (int)uVar21) {
              iVar13 = 8;
              do {
                auVar186 = vfmadd132ps_fma(*pauVar27,auVar124,auVar69);
                *pauVar27 = ZEXT1632(auVar186);
                pauVar27 = pauVar27 + 1;
                iVar13 = iVar13 + 8;
                uVar25 = uVar22;
              } while (iVar13 <= (int)uVar21);
            }
            uVar17 = uVar25 | 4;
            while ((int)uVar17 <= (int)uVar21) {
              auVar186 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar27,auVar167,auVar178);
              *(undefined1 (*) [16])*pauVar27 = auVar186;
              pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
              uVar17 = uVar25 + 8;
              uVar25 = uVar25 + 4;
            }
            if ((int)uVar25 < (int)uVar21) {
              uVar20 = CONCAT44(0,~uVar25 + uVar21);
              auVar50._8_8_ = 0;
              auVar50._0_8_ = uVar20;
              auVar178 = vpshufd_avx(auVar50,0x44);
              auVar100 = vshufps_avx(auVar100,auVar100,0);
              auVar204._16_16_ = auVar100;
              auVar204._0_16_ = auVar100;
              auVar142 = vshufps_avx(auVar142,auVar142,0);
              auVar189._16_16_ = auVar142;
              auVar189._0_16_ = auVar142;
              auVar142 = vorps_avx(auVar178,auVar177);
              auVar100 = vorps_avx(auVar178,auVar177);
              uVar18 = 0;
              do {
                auVar97._8_8_ = 0;
                auVar97._0_8_ = uVar18;
                auVar167 = vpshufd_avx(auVar97,0x44);
                auVar125._16_16_ = auVar167;
                auVar125._0_16_ = auVar167;
                auVar70 = vorps_avx(auVar266._0_32_,auVar125);
                auVar71 = vorps_avx(auVar125,auVar174._0_32_);
                auVar167 = vorps_avx(auVar178,auVar177);
                auVar217._0_8_ = auVar71._16_8_ ^ 0x8000000000000000;
                auVar217._8_4_ = auVar71._24_4_;
                auVar217._12_4_ = auVar71._28_4_ ^ 0x80000000;
                auVar186 = vpcmpgtq_avx(auVar217,auVar167);
                auVar98._0_8_ = auVar71._0_8_ ^ 0x8000000000000000;
                auVar98._8_4_ = auVar71._8_4_;
                auVar98._12_4_ = auVar71._12_4_ ^ 0x80000000;
                auVar150 = vpcmpgtq_avx(auVar98,auVar142);
                auVar186 = vpackssdw_avx(auVar150,auVar186);
                auVar218._0_8_ = auVar70._16_8_ ^ 0x8000000000000000;
                auVar218._8_4_ = auVar70._24_4_;
                auVar218._12_4_ = auVar70._28_4_ ^ 0x80000000;
                auVar167 = vpcmpgtq_avx(auVar218,auVar167);
                auVar153._0_8_ = auVar70._0_8_ ^ 0x8000000000000000;
                auVar153._8_4_ = auVar70._8_4_;
                auVar153._12_4_ = auVar70._12_4_ ^ 0x80000000;
                auVar150 = vpcmpgtq_avx(auVar153,auVar100);
                auVar167 = vpackssdw_avx(auVar150,auVar167);
                auVar174 = ZEXT3264(_DAT_00516ce0);
                auVar167 = vpackssdw_avx(auVar167 ^ auVar140,auVar186 ^ auVar140);
                auVar186 = vpmovsxwd_avx(auVar167);
                auVar167 = vpunpckhwd_avx(auVar167,auVar167);
                auVar126._16_16_ = auVar167;
                auVar126._0_16_ = auVar186;
                auVar70 = vmaskmovps_avx(auVar126,*(undefined1 (*) [32])(*pauVar27 + uVar18 * 4));
                auVar167 = vfmadd213ps_fma(auVar70,auVar204,auVar189);
                auVar70 = vmaskmovps_avx(auVar126,ZEXT1632(auVar167));
                *(undefined1 (*) [32])(*pauVar27 + uVar18 * 4) = auVar70;
                uVar18 = uVar18 + 8;
              } while ((uVar20 + 8 & 0x1fffffff8) != uVar18);
            }
          }
          else {
            pauVar12 = pauVar16;
            pauVar19 = pauVar24;
            if (bVar8 && 7 < (int)uVar21) {
              iVar13 = 8;
              do {
                uVar1 = *(undefined4 *)*pauVar19;
                auVar66._4_4_ = uVar1;
                auVar66._0_4_ = uVar1;
                auVar66._8_4_ = uVar1;
                auVar66._12_4_ = uVar1;
                auVar66._16_4_ = uVar1;
                auVar66._20_4_ = uVar1;
                auVar66._24_4_ = uVar1;
                auVar66._28_4_ = uVar1;
                uVar1 = *(undefined4 *)*pauVar12;
                auVar121._4_4_ = uVar1;
                auVar121._0_4_ = uVar1;
                auVar121._8_4_ = uVar1;
                auVar121._12_4_ = uVar1;
                auVar121._16_4_ = uVar1;
                auVar121._20_4_ = uVar1;
                auVar121._24_4_ = uVar1;
                auVar121._28_4_ = uVar1;
                auVar178 = vfmadd132ps_fma(*pauVar27,auVar124,auVar69);
                auVar178 = vfmadd213ps_fma(ZEXT1632(auVar178),auVar66,auVar121);
                *pauVar27 = ZEXT1632(auVar178);
                pauVar27 = pauVar27 + 1;
                pauVar19 = (undefined1 (*) [32])(*pauVar19 + 4);
                pauVar12 = (undefined1 (*) [32])(*pauVar12 + 4);
                iVar13 = iVar13 + 8;
              } while (iVar13 <= (int)uVar21);
            }
            if (bVar9) {
              iVar13 = 4;
              if (7 < (int)uVar21) {
                auVar67._16_16_ = auVar100;
                auVar67._0_16_ = auVar100;
                auVar148._16_16_ = auVar142;
                auVar148._0_16_ = auVar142;
                iVar13 = 8;
                do {
                  uVar1 = *(undefined4 *)*pauVar19;
                  auVar122._4_4_ = uVar1;
                  auVar122._0_4_ = uVar1;
                  auVar122._8_4_ = uVar1;
                  auVar122._12_4_ = uVar1;
                  uVar1 = *(undefined4 *)(*pauVar19 + 4);
                  auVar122._20_4_ = uVar1;
                  auVar122._16_4_ = uVar1;
                  auVar122._24_4_ = uVar1;
                  auVar122._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)*pauVar12;
                  auVar158._4_4_ = uVar1;
                  auVar158._0_4_ = uVar1;
                  auVar158._8_4_ = uVar1;
                  auVar158._12_4_ = uVar1;
                  uVar1 = *(undefined4 *)(*pauVar12 + 4);
                  auVar158._20_4_ = uVar1;
                  auVar158._16_4_ = uVar1;
                  auVar158._24_4_ = uVar1;
                  auVar158._28_4_ = uVar1;
                  auVar178 = vfmadd132ps_fma(*pauVar27,auVar148,auVar67);
                  auVar178 = vfmadd213ps_fma(ZEXT1632(auVar178),auVar122,auVar158);
                  *pauVar27 = ZEXT1632(auVar178);
                  pauVar27 = pauVar27 + 1;
                  pauVar19 = (undefined1 (*) [32])(*pauVar19 + 8);
                  pauVar12 = (undefined1 (*) [32])(*pauVar12 + 8);
                  iVar13 = iVar13 + 8;
                } while (iVar13 <= (int)uVar21);
                auVar174 = ZEXT3264(_DAT_00516ce0);
                iVar13 = uVar22 + 4;
              }
              for (; iVar13 <= (int)uVar21; iVar13 = iVar13 + 4) {
                uVar1 = *(undefined4 *)*pauVar19;
                auVar49._4_4_ = uVar1;
                auVar49._0_4_ = uVar1;
                auVar49._8_4_ = uVar1;
                auVar49._12_4_ = uVar1;
                uVar1 = *(undefined4 *)*pauVar12;
                auVar96._4_4_ = uVar1;
                auVar96._0_4_ = uVar1;
                auVar96._8_4_ = uVar1;
                auVar96._12_4_ = uVar1;
                auVar178 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar27,auVar142,auVar100);
                auVar178 = vfmadd213ps_fma(auVar178,auVar49,auVar96);
                *(undefined1 (*) [16])*pauVar27 = auVar178;
                pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
                pauVar19 = (undefined1 (*) [32])(*pauVar19 + 4);
                pauVar12 = (undefined1 (*) [32])(*pauVar12 + 4);
              }
            }
            if (bVar10) {
              auVar178 = vshufps_avx(auVar100,auVar100,0);
              auVar167 = vshufps_avx(auVar142,auVar142,0);
              uVar25 = 0;
              if (7 < (int)uVar21) {
                auVar68._16_16_ = auVar178;
                auVar68._0_16_ = auVar178;
                auVar123._16_16_ = auVar167;
                auVar123._0_16_ = auVar167;
                iVar13 = 8;
                do {
                  auVar186 = vfmadd132ps_fma(*pauVar27,auVar123,auVar68);
                  auVar186 = vfmadd213ps_fma(ZEXT1632(auVar186),*pauVar19,*pauVar12);
                  *pauVar27 = ZEXT1632(auVar186);
                  pauVar27 = pauVar27 + 1;
                  pauVar19 = pauVar19 + 1;
                  pauVar12 = pauVar12 + 1;
                  iVar13 = iVar13 + 8;
                  uVar25 = uVar22;
                } while (iVar13 <= (int)uVar21);
              }
              uVar17 = uVar25 | 4;
              while ((int)uVar17 <= (int)uVar21) {
                auVar186 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar27,auVar167,auVar178);
                auVar186 = vfmadd213ps_fma(auVar186,*(undefined1 (*) [16])*pauVar19,
                                           *(undefined1 (*) [16])*pauVar12);
                *(undefined1 (*) [16])*pauVar27 = auVar186;
                pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
                pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
                pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
                uVar17 = uVar25 + 8;
                uVar25 = uVar25 + 4;
              }
              if (uVar21 - uVar25 != 0 && (int)uVar25 <= (int)uVar21) {
                lVar11 = 0;
                do {
                  auVar178 = vfmadd132ss_fma(ZEXT416(*(uint *)(*pauVar27 + lVar11 * 4)),auVar142,
                                             auVar100);
                  auVar178 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar19 + lVar11 * 4)),auVar178,
                                             ZEXT416(*(uint *)(*pauVar12 + lVar11 * 4)));
                  *(int *)(*pauVar27 + lVar11 * 4) = auVar178._0_4_;
                  lVar11 = lVar11 + 1;
                } while (uVar21 - uVar25 != (int)lVar11);
              }
            }
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 != uVar15);
      }
    }
    else if ((iVar13 == 2) && (0 < (int)uVar22)) {
      uVar21 = iVar2 * iVar14;
      fVar28 = 1.0 / (float)iVar2;
      auVar99 = vshufps_avx(ZEXT416((uint)fVar28),ZEXT416((uint)fVar28),0);
      uVar15 = uVar21 & 0xfffffff8;
      uVar26 = 0;
      auVar266 = ZEXT3264(_DAT_00516cc0);
      auVar174 = ZEXT3264(_DAT_00516ce0);
      auVar175._8_8_ = 0x8000000000000000;
      auVar175._0_8_ = 0x8000000000000000;
      auVar140 = vpcmpeqd_avx(auVar140,auVar140);
      do {
        pauVar27 = (undefined1 (*) [32])
                   ((long)bottom_top_blob->w * uVar26 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        auVar190 = ZEXT1664(ZEXT816(0) << 0x40);
        pauVar12 = pauVar27;
        uVar25 = 0;
        if (7 < (int)uVar21) {
          iVar13 = 8;
          do {
            auVar190 = ZEXT3264(CONCAT428(auVar190._28_4_ + *(float *)(*pauVar12 + 0x1c),
                                          CONCAT424(auVar190._24_4_ + *(float *)(*pauVar12 + 0x18),
                                                    CONCAT420(auVar190._20_4_ +
                                                              *(float *)(*pauVar12 + 0x14),
                                                              CONCAT416(auVar190._16_4_ +
                                                                        *(float *)(*pauVar12 + 0x10)
                                                                        ,CONCAT412(auVar190._12_4_ +
                                                                                   *(float *)(*
                                                  pauVar12 + 0xc),
                                                  CONCAT48(auVar190._8_4_ +
                                                           *(float *)(*pauVar12 + 8),
                                                           CONCAT44(auVar190._4_4_ +
                                                                    *(float *)(*pauVar12 + 4),
                                                                    auVar190._0_4_ +
                                                                    *(float *)*pauVar12))))))));
            pauVar12 = pauVar12 + 1;
            iVar13 = iVar13 + 8;
            uVar25 = uVar15;
          } while (iVar13 <= (int)uVar21);
        }
        uVar17 = uVar25 | 4;
        auVar196 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar30 = auVar196._0_4_;
          fVar73 = auVar196._4_4_;
          fVar74 = auVar196._8_4_;
          fVar75 = auVar196._12_4_;
          if ((int)uVar21 < (int)uVar17) break;
          auVar196._0_4_ = fVar30 + *(float *)*pauVar12;
          auVar196._4_4_ = fVar73 + *(float *)(*pauVar12 + 4);
          auVar196._8_4_ = fVar74 + *(float *)(*pauVar12 + 8);
          auVar196._12_4_ = fVar75 + *(float *)(*pauVar12 + 0xc);
          pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
          uVar17 = uVar25 + 8;
          uVar25 = uVar25 + 4;
        }
        auVar142 = ZEXT816(0) << 0x20;
        fVar29 = 0.0;
        auVar70 = auVar266._0_32_;
        if ((int)uVar25 < (int)uVar21) {
          uVar20 = CONCAT44(0,~uVar25 + uVar21);
          auVar31._8_8_ = 0;
          auVar31._0_8_ = uVar20;
          auVar178 = vpshufd_avx(auVar31,0x44);
          auVar142 = vorps_avx(auVar178,auVar175);
          auVar100 = vorps_avx(auVar178,auVar175);
          uVar18 = 0;
          auVar160 = ZEXT1664(ZEXT816(0) << 0x40);
          do {
            auVar206 = auVar160;
            auVar76._8_8_ = 0;
            auVar76._0_8_ = uVar18;
            auVar167 = vpshufd_avx(auVar76,0x44);
            auVar103._16_16_ = auVar167;
            auVar103._0_16_ = auVar167;
            auVar71 = vorps_avx(auVar70,auVar103);
            auVar241 = vorps_avx(auVar103,auVar174._0_32_);
            auVar167 = vorps_avx(auVar178,auVar175);
            auVar226._8_4_ = auVar241._24_4_;
            auVar226._0_8_ = auVar241._16_8_ ^ 0x8000000000000000;
            auVar226._12_4_ = auVar241._28_4_ ^ 0x80000000;
            auVar150 = vpcmpgtq_avx(auVar226,auVar167);
            auVar77._8_4_ = auVar241._8_4_;
            auVar242._8_4_ = auVar77._8_4_;
            auVar242._0_8_ = auVar241._0_8_ ^ 0x8000000000000000;
            auVar242._12_4_ = auVar241._12_4_ ^ 0x80000000;
            auVar186 = vpcmpgtq_avx(auVar242,auVar142);
            auVar186 = vpackssdw_avx(auVar186,auVar150);
            auVar252._0_8_ = auVar71._16_8_ ^ 0x8000000000000000;
            auVar252._8_4_ = auVar71._24_4_;
            auVar252._12_4_ = auVar71._28_4_ ^ 0x80000000;
            auVar141 = vpcmpgtq_avx(auVar252,auVar167);
            auVar253._0_8_ = auVar71._0_8_ ^ 0x8000000000000000;
            auVar253._8_4_ = auVar71._8_4_;
            auVar253._12_4_ = auVar71._12_4_ ^ 0x80000000;
            auVar167 = vpcmpgtq_avx(auVar253,auVar100);
            auVar167 = vpackssdw_avx(auVar167,auVar141);
            auVar167 = vpackssdw_avx(auVar167 ^ auVar140,auVar186 ^ auVar140);
            auVar186 = vpmovsxwd_avx(auVar167);
            auVar167 = vpunpckhwd_avx(auVar167,auVar167);
            auVar249._16_16_ = auVar167;
            auVar249._0_16_ = auVar186;
            auVar159 = vmaskmovps_avx(auVar249,*(undefined1 (*) [32])(*pauVar12 + uVar18 * 4));
            auVar230._0_4_ = auVar159._0_4_ + auVar206._0_4_;
            auVar230._4_4_ = auVar159._4_4_ + auVar206._4_4_;
            auVar230._8_4_ = auVar159._8_4_ + auVar206._8_4_;
            auVar230._12_4_ = auVar159._12_4_ + auVar206._12_4_;
            auVar235._16_4_ = auVar159._16_4_ + auVar206._16_4_;
            auVar235._0_16_ = auVar230;
            auVar235._20_4_ = auVar159._20_4_ + auVar206._20_4_;
            auVar235._24_4_ = auVar159._24_4_ + auVar206._24_4_;
            auVar235._28_4_ = auVar159._28_4_ + auVar206._28_4_;
            uVar18 = uVar18 + 8;
            auVar160 = ZEXT3264(auVar235);
          } while ((uVar20 + 8 & 0x1fffffff8) != uVar18);
          auVar142 = vorps_avx(auVar178,auVar175);
          auVar77._0_8_ = auVar241._0_8_ ^ 0x8000000000000000;
          auVar77._12_4_ = auVar241._12_4_ ^ 0x80000000;
          auVar142 = vpcmpgtq_avx(auVar77,auVar142);
          auVar100 = vpackssdw_avx(auVar142,auVar150);
          auVar142 = vorps_avx(auVar178,auVar175);
          auVar129._0_8_ = auVar71._0_8_ ^ 0x8000000000000000;
          auVar129._8_4_ = auVar71._8_4_;
          auVar129._12_4_ = auVar71._12_4_ ^ 0x80000000;
          auVar142 = vpcmpgtq_avx(auVar129,auVar142);
          auVar142 = vpackssdw_avx(auVar142,auVar141);
          auVar142 = vblendvps_avx(auVar206._0_16_,auVar230,auVar142 ^ auVar140);
          auVar100 = vblendvps_avx(auVar206._16_16_,auVar235._16_16_,auVar100 ^ auVar140);
          auVar142 = vhaddps_avx(auVar100,auVar142);
          auVar142 = vhaddps_avx(auVar142,auVar142);
          auVar142 = vhaddps_avx(auVar142,auVar142);
          fVar29 = auVar142._0_4_;
          auVar142 = ZEXT816(0);
        }
        auVar160 = ZEXT1664(auVar142 << 0x20);
        local_b8 = auVar99._0_4_;
        fStack_b4 = auVar99._4_4_;
        fStack_b0 = auVar99._8_4_;
        fStack_ac = auVar99._12_4_;
        if (iVar14 == 8) {
          auVar183._0_4_ = auVar190._0_4_ * local_b8;
          auVar183._4_4_ = auVar190._4_4_ * fStack_b4;
          auVar183._8_4_ = auVar190._8_4_ * fStack_b0;
          auVar183._12_4_ = auVar190._12_4_ * fStack_ac;
          auVar191._16_4_ = auVar190._16_4_ * local_b8;
          auVar191._0_16_ = auVar183;
          auVar191._20_4_ = auVar190._20_4_ * fStack_b4;
          auVar191._28_36_ = auVar190._28_36_;
          auVar191._24_4_ = auVar190._24_4_ * fStack_b0;
          auVar52 = auVar191._0_32_;
          auVar190 = ZEXT3264(auVar52);
          auVar197 = vshufps_avx(auVar183,auVar183,0);
          bVar8 = true;
          bVar10 = false;
          auVar160 = ZEXT1664(auVar183);
          bVar9 = false;
        }
        else {
          if (iVar14 == 4) {
            auVar197._0_4_ = (fVar30 + auVar190._16_4_ + auVar190._0_4_) * local_b8;
            auVar197._4_4_ = (fVar73 + auVar190._20_4_ + auVar190._4_4_) * fStack_b4;
            auVar197._8_4_ = (fVar74 + auVar190._24_4_ + auVar190._8_4_) * fStack_b0;
            auVar197._12_4_ = (fVar75 + auVar190._28_4_ + auVar190._12_4_) * fStack_ac;
            bVar9 = true;
            bVar10 = false;
            auVar160 = ZEXT1664(auVar197);
            auVar142 = auVar197;
          }
          else {
            if (iVar14 != 1) {
              auVar142 = ZEXT816(0);
              auVar197 = ZEXT816(0) << 0x40;
            }
            else {
              auVar100 = vshufpd_avx(auVar196,auVar196,1);
              auVar142 = vhaddps_avx(auVar190._16_16_,auVar190._0_16_);
              auVar130._0_4_ = fVar30 + auVar100._0_4_;
              auVar130._4_4_ = fVar73 + auVar100._4_4_;
              auVar130._8_4_ = fVar74 + auVar100._8_4_;
              auVar130._12_4_ = fVar75 + auVar100._12_4_;
              auVar142 = vhaddps_avx(auVar142,auVar142);
              auVar100 = vmovshdup_avx(auVar130);
              auVar142 = vhaddps_avx(auVar142,auVar142);
              fVar30 = (auVar142._0_4_ + auVar100._0_4_ + auVar130._0_4_ + fVar29) * fVar28;
              auVar160 = ZEXT464((uint)fVar30);
              auVar142 = vblendps_avx(ZEXT416((uint)fVar30),_DAT_00514070,0xe);
              auVar197 = vshufps_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30),0);
            }
            bVar10 = iVar14 == 1;
            bVar9 = false;
          }
          auVar190 = ZEXT1664(auVar142);
          auVar52._16_16_ = auVar197;
          auVar52._0_16_ = auVar197;
          bVar8 = false;
        }
        auVar212 = (undefined1  [36])0x0;
        pauVar12 = pauVar27;
        if ((int)uVar21 < 8) {
          auVar71 = SUB6432(ZEXT864(0),0);
          uVar25 = 0;
        }
        else {
          auVar206 = ZEXT864(0);
          iVar13 = 8;
          do {
            auVar71 = vsubps_avx(*pauVar12,auVar52);
            auVar142 = vfmadd231ps_fma(auVar206._0_32_,auVar71,auVar71);
            auVar206 = ZEXT1664(auVar142);
            auVar71 = ZEXT1632(auVar142);
            pauVar12 = pauVar12 + 1;
            iVar13 = iVar13 + 8;
            uVar25 = uVar15;
          } while (iVar13 <= (int)uVar21);
        }
        auVar142 = ZEXT816(0) << 0x40;
        uVar17 = uVar25 | 4;
        while ((int)uVar17 <= (int)uVar21) {
          auVar100 = vsubps_avx(*(undefined1 (*) [16])*pauVar12,auVar197);
          auVar142 = vfmadd231ps_fma(auVar142,auVar100,auVar100);
          pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
          uVar17 = uVar25 + 8;
          uVar25 = uVar25 + 4;
        }
        fVar30 = 0.0;
        if ((int)uVar25 < (int)uVar21) {
          uVar20 = CONCAT44(0,~uVar25 + uVar21);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar20;
          auVar167 = vpshufd_avx(auVar32,0x44);
          auVar212 = ZEXT436(auVar167._12_4_);
          auVar150 = auVar160._0_16_;
          auVar100 = vshufps_avx(auVar150,auVar150,0);
          auVar263._16_16_ = auVar100;
          auVar263._0_16_ = auVar100;
          auVar100 = vorps_avx(auVar167,auVar175);
          auVar178 = vorps_avx(auVar167,auVar175);
          uVar18 = 0;
          auVar186 = ZEXT416(0) << 0x40;
          do {
            auVar248 = auVar186;
            auVar78._8_8_ = 0;
            auVar78._0_8_ = uVar18;
            auVar186 = vpshufd_avx(auVar78,0x44);
            auVar104._16_16_ = auVar186;
            auVar104._0_16_ = auVar186;
            auVar241 = vorps_avx(auVar104,auVar70);
            auVar159 = vorps_avx(auVar104,auVar174._0_32_);
            auVar186 = vorps_avx(auVar167,auVar175);
            auVar238._0_8_ = auVar159._16_8_ ^ 0x8000000000000000;
            auVar238._8_4_ = auVar159._24_4_;
            auVar238._12_4_ = auVar159._28_4_ ^ 0x80000000;
            auVar154 = vpcmpgtq_avx(auVar238,auVar186);
            auVar254._0_8_ = auVar159._0_8_ ^ 0x8000000000000000;
            auVar79._8_4_ = auVar159._8_4_;
            auVar254._8_4_ = auVar79._8_4_;
            auVar254._12_4_ = auVar159._12_4_ ^ 0x80000000;
            auVar141 = vpcmpgtq_avx(auVar254,auVar100);
            auVar141 = vpackssdw_avx(auVar141,auVar154);
            auVar161._0_8_ = auVar241._16_8_ ^ 0x8000000000000000;
            auVar161._8_4_ = auVar241._24_4_;
            auVar161._12_4_ = auVar241._28_4_ ^ 0x80000000;
            auVar219 = vpcmpgtq_avx(auVar161,auVar186);
            auVar162._0_8_ = auVar241._0_8_ ^ 0x8000000000000000;
            auVar131._8_4_ = auVar241._8_4_;
            auVar162._8_4_ = auVar131._8_4_;
            auVar162._12_4_ = auVar241._12_4_ ^ 0x80000000;
            auVar186 = vpcmpgtq_avx(auVar162,auVar178);
            auVar186 = vpackssdw_avx(auVar186,auVar219);
            auVar186 = vpackssdw_avx(auVar186 ^ auVar140,auVar141 ^ auVar140);
            auVar141 = vpmovsxwd_avx(auVar186);
            auVar186 = vpunpckhwd_avx(auVar186,auVar186);
            auVar170._16_16_ = auVar186;
            auVar170._0_16_ = auVar141;
            auVar149 = vmaskmovps_avx(auVar170,*(undefined1 (*) [32])(*pauVar12 + uVar18 * 4));
            auVar149 = vsubps_avx(auVar149,auVar263);
            auVar174 = ZEXT3264(_DAT_00516ce0);
            auVar186 = vfmadd213ps_fma(auVar149,auVar149,ZEXT1632(auVar248));
            uVar18 = uVar18 + 8;
          } while ((uVar20 + 8 & 0x1fffffff8) != uVar18);
          auVar100 = vorps_avx(auVar167,auVar175);
          auVar79._0_8_ = auVar159._0_8_ ^ 0x8000000000000000;
          auVar79._12_4_ = auVar159._12_4_ ^ 0x80000000;
          auVar100 = vpcmpgtq_avx(auVar79,auVar100);
          auVar178 = vpackssdw_avx(auVar100,auVar154);
          auVar100 = vorps_avx(auVar167,auVar175);
          auVar131._0_8_ = auVar241._0_8_ ^ 0x8000000000000000;
          auVar131._12_4_ = auVar241._12_4_ ^ 0x80000000;
          auVar100 = vpcmpgtq_avx(auVar131,auVar100);
          auVar100 = vpackssdw_avx(auVar100,auVar219);
          auVar100 = vblendvps_avx(auVar248,auVar186,auVar100 ^ auVar140);
          auVar178 = vblendvps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,auVar178 ^ auVar140);
          auVar100 = vhaddps_avx(auVar178,auVar100);
          auVar100 = vhaddps_avx(auVar100,auVar100);
          auVar100 = vhaddps_avx(auVar100,auVar100);
          fVar30 = auVar100._0_4_;
          auVar266 = ZEXT3264(auVar70);
          auVar190 = ZEXT3264(auVar190._0_32_);
          auVar160 = ZEXT1664(auVar150);
        }
        auVar100 = ZEXT416((uint)*(float *)(&this->field_0xd4 + (long)pp_Var3[-3]));
        auVar108 = auVar190._0_32_;
        if (bVar8) {
          auVar207._0_4_ = auVar71._0_4_ * local_b8;
          auVar207._4_4_ = auVar71._4_4_ * fStack_b4;
          auVar207._8_4_ = auVar71._8_4_ * fStack_b0;
          auVar207._12_4_ = auVar71._12_4_ * fStack_ac;
          auVar207._16_4_ = auVar71._16_4_ * local_b8;
          auVar207._20_4_ = auVar71._20_4_ * fStack_b4;
          auVar207._24_4_ = auVar71._24_4_ * fStack_b0;
          auVar207._28_36_ = auVar212;
          auVar206 = ZEXT3264(auVar207._0_32_);
        }
        else {
          auVar206 = ZEXT1664(ZEXT816(0) << 0x40);
        }
        auVar243 = auVar142;
        if (bVar9) {
          auVar243._0_4_ = auVar142._0_4_ + auVar71._0_4_ + auVar71._16_4_;
          auVar243._4_4_ = auVar142._4_4_ + auVar71._4_4_ + auVar71._20_4_;
          auVar243._8_4_ = auVar142._8_4_ + auVar71._8_4_ + auVar71._24_4_;
          auVar243._12_4_ = auVar142._12_4_ + auVar71._12_4_ + auVar71._28_4_;
          auVar70 = vblendps_avx(auVar206._0_32_,
                                 ZEXT1632(CONCAT412(auVar243._12_4_ * fStack_ac,
                                                    CONCAT48(auVar243._8_4_ * fStack_b0,
                                                             CONCAT44(auVar243._4_4_ * fStack_b4,
                                                                      auVar243._0_4_ * local_b8)))),
                                 0xf);
          auVar206 = ZEXT3264(auVar70);
        }
        if (bVar10) {
          auVar142 = vshufpd_avx(auVar243,auVar243,1);
          auVar80._0_4_ = auVar243._0_4_ + auVar142._0_4_;
          auVar80._4_4_ = auVar243._4_4_ + auVar142._4_4_;
          auVar80._8_4_ = auVar243._8_4_ + auVar142._8_4_;
          auVar80._12_4_ = auVar243._12_4_ + auVar142._12_4_;
          auVar142 = vhaddps_avx(auVar71._16_16_,auVar71._0_16_);
          auVar178 = vmovshdup_avx(auVar80);
          auVar142 = vhaddps_avx(auVar142,auVar142);
          auVar142 = vhaddps_avx(auVar142,auVar142);
          auVar70 = vblendps_avx(auVar206._0_32_,
                                 ZEXT432((uint)((fVar30 + auVar142._0_4_ + auVar178._0_4_ +
                                                auVar80._0_4_) * fVar28)),1);
          auVar206 = ZEXT3264(auVar70);
        }
        fVar30 = auVar206._0_4_;
        auVar57 = auVar206._0_32_;
        if (iVar14 == 1) {
          fVar30 = fVar30 + *(float *)(&this->field_0xd4 + (long)pp_Var3[-3]);
          auVar142 = vrsqrtss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30));
          auVar100 = vfmadd213ss_fma(ZEXT416((uint)(fVar30 * auVar142._0_4_)),auVar142,
                                     ZEXT416(0xc0400000));
          fVar30 = auVar142._0_4_ * -0.5 * auVar100._0_4_;
          auVar57 = vblendps_avx(auVar57,ZEXT432((uint)fVar30),1);
          auVar108 = vblendps_avx(auVar108,ZEXT432((uint)(fVar30 * -auVar160._0_4_)),1);
        }
        else if (iVar14 == 4) {
          auVar142 = vshufps_avx(auVar100,auVar100,0);
          auVar33._0_4_ = fVar30 + auVar142._0_4_;
          auVar33._4_4_ = auVar206._4_4_ + auVar142._4_4_;
          auVar33._8_4_ = auVar206._8_4_ + auVar142._8_4_;
          auVar33._12_4_ = auVar206._12_4_ + auVar142._12_4_;
          auVar142 = vrsqrtps_avx(auVar33);
          auVar34._0_4_ = auVar33._0_4_ * auVar142._0_4_;
          auVar34._4_4_ = auVar33._4_4_ * auVar142._4_4_;
          auVar34._8_4_ = auVar33._8_4_ * auVar142._8_4_;
          auVar34._12_4_ = auVar33._12_4_ * auVar142._12_4_;
          auVar132._8_4_ = 0xc0400000;
          auVar132._0_8_ = 0xc0400000c0400000;
          auVar132._12_4_ = 0xc0400000;
          auVar100 = vfmadd213ps_fma(auVar34,auVar142,auVar132);
          fVar30 = auVar142._0_4_ * -0.5 * auVar100._0_4_;
          fVar73 = auVar142._4_4_ * -0.5 * auVar100._4_4_;
          fVar74 = auVar142._8_4_ * -0.5 * auVar100._8_4_;
          fVar75 = auVar142._12_4_ * -0.5 * auVar100._12_4_;
          auVar57 = vblendps_avx(auVar57,ZEXT1632(CONCAT412(fVar75,CONCAT48(fVar74,CONCAT44(fVar73,
                                                  fVar30)))),0xf);
          auVar108 = vblendps_avx(auVar108,ZEXT1632(CONCAT412(fVar75 * -auVar190._12_4_,
                                                              CONCAT48(fVar74 * -auVar190._8_4_,
                                                                       CONCAT44(fVar73 * -auVar190.
                                                  _4_4_,fVar30 * -auVar190._0_4_)))),0xf);
        }
        else if (iVar14 == 8) {
          auVar142 = vshufps_avx(auVar100,auVar100,0);
          auVar53._0_4_ = fVar30 + auVar142._0_4_;
          auVar53._4_4_ = auVar206._4_4_ + auVar142._4_4_;
          auVar53._8_4_ = auVar206._8_4_ + auVar142._8_4_;
          auVar53._12_4_ = auVar206._12_4_ + auVar142._12_4_;
          auVar53._16_4_ = auVar206._16_4_ + auVar142._0_4_;
          auVar53._20_4_ = auVar206._20_4_ + auVar142._4_4_;
          auVar53._24_4_ = auVar206._24_4_ + auVar142._8_4_;
          auVar53._28_4_ = auVar206._28_4_ + auVar142._12_4_;
          auVar70 = vrsqrtps_avx(auVar53);
          auVar5._4_4_ = auVar53._4_4_ * auVar70._4_4_;
          auVar5._0_4_ = auVar53._0_4_ * auVar70._0_4_;
          auVar5._8_4_ = auVar53._8_4_ * auVar70._8_4_;
          auVar5._12_4_ = auVar53._12_4_ * auVar70._12_4_;
          auVar5._16_4_ = auVar53._16_4_ * auVar70._16_4_;
          auVar5._20_4_ = auVar53._20_4_ * auVar70._20_4_;
          auVar5._24_4_ = auVar53._24_4_ * auVar70._24_4_;
          auVar5._28_4_ = auVar53._28_4_;
          auVar143._8_4_ = 0xc0400000;
          auVar143._0_8_ = 0xc0400000c0400000;
          auVar143._12_4_ = 0xc0400000;
          auVar143._16_4_ = 0xc0400000;
          auVar143._20_4_ = 0xc0400000;
          auVar143._24_4_ = 0xc0400000;
          auVar143._28_4_ = 0xc0400000;
          auVar142 = vfmadd213ps_fma(auVar5,auVar70,auVar143);
          auVar208._0_4_ = auVar70._0_4_ * -0.5 * auVar142._0_4_;
          auVar208._4_4_ = auVar70._4_4_ * -0.5 * auVar142._4_4_;
          auVar208._8_4_ = auVar70._8_4_ * -0.5 * auVar142._8_4_;
          auVar208._12_4_ = auVar70._12_4_ * -0.5 * auVar142._12_4_;
          auVar208._16_4_ = auVar70._16_4_ * -0.5 * 0.0;
          auVar208._20_4_ = auVar70._20_4_ * -0.5 * 0.0;
          auVar208._28_36_ = auVar206._28_36_;
          auVar208._24_4_ = auVar70._24_4_ * -0.5 * 0.0;
          auVar57 = auVar208._0_32_;
          auVar192._0_4_ = auVar208._0_4_ * -auVar190._0_4_;
          auVar192._4_4_ = auVar208._4_4_ * -auVar190._4_4_;
          auVar192._8_4_ = auVar208._8_4_ * -auVar190._8_4_;
          auVar192._12_4_ = auVar208._12_4_ * -auVar190._12_4_;
          auVar192._16_4_ = auVar208._16_4_ * -auVar190._16_4_;
          auVar192._20_4_ = auVar208._20_4_ * -auVar190._20_4_;
          auVar192._28_36_ = auVar190._28_36_;
          auVar192._24_4_ = auVar208._24_4_ * -auVar190._24_4_;
          auVar108 = auVar192._0_32_;
        }
        auVar142 = auVar108._0_16_;
        auVar100 = auVar57._0_16_;
        if (*(int *)(&this->field_0xd8 + (long)pp_Var3[-3]) == 0) {
          auVar178 = auVar100;
          auVar167 = auVar142;
          if (!bVar9) {
            auVar178 = vshufps_avx(auVar100,auVar100,0);
            auVar167 = vshufps_avx(auVar142,auVar142,0);
          }
          if (!bVar8) {
            auVar57._16_16_ = auVar178;
            auVar57._0_16_ = auVar178;
            auVar108._16_16_ = auVar167;
            auVar108._0_16_ = auVar167;
          }
          uVar25 = 0;
          if (7 < (int)uVar21) {
            iVar13 = 8;
            do {
              auVar186 = vfmadd132ps_fma(*pauVar27,auVar108,auVar57);
              *pauVar27 = ZEXT1632(auVar186);
              pauVar27 = pauVar27 + 1;
              iVar13 = iVar13 + 8;
              uVar25 = uVar15;
            } while (iVar13 <= (int)uVar21);
          }
          uVar17 = uVar25 | 4;
          while ((int)uVar17 <= (int)uVar21) {
            auVar186 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar27,auVar167,auVar178);
            *(undefined1 (*) [16])*pauVar27 = auVar186;
            pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
            uVar17 = uVar25 + 8;
            uVar25 = uVar25 + 4;
          }
          if ((int)uVar25 < (int)uVar21) {
            uVar20 = CONCAT44(0,~uVar25 + uVar21);
            auVar36._8_8_ = 0;
            auVar36._0_8_ = uVar20;
            auVar178 = vpshufd_avx(auVar36,0x44);
            auVar100 = vshufps_avx(auVar100,auVar100,0);
            auVar202._16_16_ = auVar100;
            auVar202._0_16_ = auVar100;
            auVar142 = vshufps_avx(auVar142,auVar142,0);
            auVar187._16_16_ = auVar142;
            auVar187._0_16_ = auVar142;
            auVar142 = vorps_avx(auVar178,auVar175);
            auVar100 = vorps_avx(auVar178,auVar175);
            uVar18 = 0;
            do {
              auVar82._8_8_ = 0;
              auVar82._0_8_ = uVar18;
              auVar167 = vpshufd_avx(auVar82,0x44);
              auVar109._16_16_ = auVar167;
              auVar109._0_16_ = auVar167;
              auVar70 = vorps_avx(auVar266._0_32_,auVar109);
              auVar71 = vorps_avx(auVar109,auVar174._0_32_);
              auVar167 = vorps_avx(auVar178,auVar175);
              auVar213._0_8_ = auVar71._16_8_ ^ 0x8000000000000000;
              auVar213._8_4_ = auVar71._24_4_;
              auVar213._12_4_ = auVar71._28_4_ ^ 0x80000000;
              auVar186 = vpcmpgtq_avx(auVar213,auVar167);
              auVar83._0_8_ = auVar71._0_8_ ^ 0x8000000000000000;
              auVar83._8_4_ = auVar71._8_4_;
              auVar83._12_4_ = auVar71._12_4_ ^ 0x80000000;
              auVar150 = vpcmpgtq_avx(auVar83,auVar142);
              auVar186 = vpackssdw_avx(auVar150,auVar186);
              auVar214._0_8_ = auVar70._16_8_ ^ 0x8000000000000000;
              auVar214._8_4_ = auVar70._24_4_;
              auVar214._12_4_ = auVar70._28_4_ ^ 0x80000000;
              auVar167 = vpcmpgtq_avx(auVar214,auVar167);
              auVar151._0_8_ = auVar70._0_8_ ^ 0x8000000000000000;
              auVar151._8_4_ = auVar70._8_4_;
              auVar151._12_4_ = auVar70._12_4_ ^ 0x80000000;
              auVar150 = vpcmpgtq_avx(auVar151,auVar100);
              auVar167 = vpackssdw_avx(auVar150,auVar167);
              auVar174 = ZEXT3264(_DAT_00516ce0);
              auVar167 = vpackssdw_avx(auVar167 ^ auVar140,auVar186 ^ auVar140);
              auVar186 = vpmovsxwd_avx(auVar167);
              auVar167 = vpunpckhwd_avx(auVar167,auVar167);
              auVar110._16_16_ = auVar167;
              auVar110._0_16_ = auVar186;
              auVar70 = vmaskmovps_avx(auVar110,*(undefined1 (*) [32])(*pauVar27 + uVar18 * 4));
              auVar167 = vfmadd213ps_fma(auVar70,auVar202,auVar187);
              auVar70 = vmaskmovps_avx(auVar110,ZEXT1632(auVar167));
              *(undefined1 (*) [32])(*pauVar27 + uVar18 * 4) = auVar70;
              uVar18 = uVar18 + 8;
            } while ((uVar20 + 8 & 0x1fffffff8) != uVar18);
          }
        }
        else {
          pauVar12 = pauVar24;
          pauVar19 = pauVar16;
          if (bVar8 && 7 < (int)uVar21) {
            iVar13 = 8;
            do {
              uVar1 = *(undefined4 *)*pauVar12;
              auVar54._4_4_ = uVar1;
              auVar54._0_4_ = uVar1;
              auVar54._8_4_ = uVar1;
              auVar54._12_4_ = uVar1;
              auVar54._16_4_ = uVar1;
              auVar54._20_4_ = uVar1;
              auVar54._24_4_ = uVar1;
              auVar54._28_4_ = uVar1;
              uVar1 = *(undefined4 *)*pauVar19;
              auVar105._4_4_ = uVar1;
              auVar105._0_4_ = uVar1;
              auVar105._8_4_ = uVar1;
              auVar105._12_4_ = uVar1;
              auVar105._16_4_ = uVar1;
              auVar105._20_4_ = uVar1;
              auVar105._24_4_ = uVar1;
              auVar105._28_4_ = uVar1;
              auVar178 = vfmadd132ps_fma(*pauVar27,auVar108,auVar57);
              auVar178 = vfmadd213ps_fma(ZEXT1632(auVar178),auVar54,auVar105);
              *pauVar27 = ZEXT1632(auVar178);
              pauVar27 = pauVar27 + 1;
              pauVar12 = (undefined1 (*) [32])(*pauVar12 + 4);
              pauVar19 = (undefined1 (*) [32])(*pauVar19 + 4);
              iVar13 = iVar13 + 8;
            } while (iVar13 <= (int)uVar21);
          }
          if (bVar9) {
            iVar13 = 4;
            if (7 < (int)uVar21) {
              auVar55._16_16_ = auVar100;
              auVar55._0_16_ = auVar100;
              auVar144._16_16_ = auVar142;
              auVar144._0_16_ = auVar142;
              iVar13 = 8;
              do {
                uVar1 = *(undefined4 *)*pauVar12;
                auVar106._4_4_ = uVar1;
                auVar106._0_4_ = uVar1;
                auVar106._8_4_ = uVar1;
                auVar106._12_4_ = uVar1;
                uVar1 = *(undefined4 *)(*pauVar12 + 4);
                auVar106._20_4_ = uVar1;
                auVar106._16_4_ = uVar1;
                auVar106._24_4_ = uVar1;
                auVar106._28_4_ = uVar1;
                uVar1 = *(undefined4 *)*pauVar19;
                auVar156._4_4_ = uVar1;
                auVar156._0_4_ = uVar1;
                auVar156._8_4_ = uVar1;
                auVar156._12_4_ = uVar1;
                uVar1 = *(undefined4 *)(*pauVar19 + 4);
                auVar156._20_4_ = uVar1;
                auVar156._16_4_ = uVar1;
                auVar156._24_4_ = uVar1;
                auVar156._28_4_ = uVar1;
                auVar178 = vfmadd132ps_fma(*pauVar27,auVar144,auVar55);
                auVar178 = vfmadd213ps_fma(ZEXT1632(auVar178),auVar106,auVar156);
                *pauVar27 = ZEXT1632(auVar178);
                pauVar27 = pauVar27 + 1;
                pauVar12 = (undefined1 (*) [32])(*pauVar12 + 8);
                pauVar19 = (undefined1 (*) [32])(*pauVar19 + 8);
                iVar13 = iVar13 + 8;
              } while (iVar13 <= (int)uVar21);
              auVar174 = ZEXT3264(_DAT_00516ce0);
              iVar13 = uVar15 + 4;
            }
            for (; iVar13 <= (int)uVar21; iVar13 = iVar13 + 4) {
              uVar1 = *(undefined4 *)*pauVar12;
              auVar35._4_4_ = uVar1;
              auVar35._0_4_ = uVar1;
              auVar35._8_4_ = uVar1;
              auVar35._12_4_ = uVar1;
              uVar1 = *(undefined4 *)*pauVar19;
              auVar81._4_4_ = uVar1;
              auVar81._0_4_ = uVar1;
              auVar81._8_4_ = uVar1;
              auVar81._12_4_ = uVar1;
              auVar178 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar27,auVar142,auVar100);
              auVar178 = vfmadd213ps_fma(auVar178,auVar35,auVar81);
              *(undefined1 (*) [16])*pauVar27 = auVar178;
              pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
              pauVar12 = (undefined1 (*) [32])(*pauVar12 + 4);
              pauVar19 = (undefined1 (*) [32])(*pauVar19 + 4);
            }
          }
          if (bVar10) {
            auVar178 = vshufps_avx(auVar100,auVar100,0);
            auVar167 = vshufps_avx(auVar142,auVar142,0);
            uVar25 = 0;
            if (7 < (int)uVar21) {
              auVar56._16_16_ = auVar178;
              auVar56._0_16_ = auVar178;
              auVar107._16_16_ = auVar167;
              auVar107._0_16_ = auVar167;
              iVar13 = 8;
              do {
                auVar186 = vfmadd132ps_fma(*pauVar27,auVar107,auVar56);
                auVar186 = vfmadd213ps_fma(ZEXT1632(auVar186),*pauVar12,*pauVar19);
                *pauVar27 = ZEXT1632(auVar186);
                pauVar27 = pauVar27 + 1;
                pauVar12 = pauVar12 + 1;
                pauVar19 = pauVar19 + 1;
                iVar13 = iVar13 + 8;
                uVar25 = uVar15;
              } while (iVar13 <= (int)uVar21);
            }
            uVar17 = uVar25 | 4;
            while ((int)uVar17 <= (int)uVar21) {
              auVar186 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar27,auVar167,auVar178);
              auVar186 = vfmadd213ps_fma(auVar186,*(undefined1 (*) [16])*pauVar12,
                                         *(undefined1 (*) [16])*pauVar19);
              *(undefined1 (*) [16])*pauVar27 = auVar186;
              pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
              pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
              pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
              uVar17 = uVar25 + 8;
              uVar25 = uVar25 + 4;
            }
            if (uVar21 - uVar25 != 0 && (int)uVar25 <= (int)uVar21) {
              lVar11 = 0;
              do {
                auVar178 = vfmadd132ss_fma(ZEXT416(*(uint *)(*pauVar27 + lVar11 * 4)),auVar142,
                                           auVar100);
                auVar178 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar12 + lVar11 * 4)),auVar178,
                                           ZEXT416(*(uint *)(*pauVar19 + lVar11 * 4)));
                *(int *)(*pauVar27 + lVar11 * 4) = auVar178._0_4_;
                lVar11 = lVar11 + 1;
              } while (uVar21 - uVar25 != (int)lVar11);
            }
          }
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 != uVar22);
    }
  }
  return 0;
}

Assistant:

int LayerNorm_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;

    const float* gamma = gamma_data;
    const float* beta = beta_data;

    if (dims == 1)
    {
        int elemcount = w * elempack;
        float* ptr = bottom_top_blob;
        // 1D layer norm is special. Treat them as unpacked.
        fast_1d_layer_norm(ptr, 1, elemcount, elemcount, gamma, beta, affine, eps);
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; ++i)
        {
            float* ptr = bottom_top_blob.row(i);
            fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
        }
    }

    if (dims == 3)
    {
        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                for (int i = 0; i < h; ++i)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);
                    fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
                }
            }
        }
        else // if (affine_size == w * h)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                float* ptr = bottom_top_blob.channel(q);
                fast_1d_layer_norm(ptr, elempack, w * h, w * h * elempack, gamma, beta, affine, eps);
            }
        }
    }

    return 0;
}